

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  void *pvVar5;
  __int_type_conflict _Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  int iVar45;
  uint uVar46;
  uint uVar47;
  ulong uVar48;
  long lVar50;
  byte bVar51;
  uint uVar52;
  ulong uVar53;
  uint uVar54;
  ulong uVar55;
  undefined4 uVar56;
  undefined8 in_R10;
  bool bVar57;
  ulong uVar58;
  float fVar59;
  float fVar60;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar85;
  float fVar87;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar88;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar89;
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar143;
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar144;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar162;
  float fVar180;
  float fVar181;
  vint4 ai_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar186 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar193;
  undefined1 auVar192 [32];
  float fVar197;
  float fVar207;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar208;
  float fVar223;
  vfloat4 a0_2;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar224;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  vfloat4 a0_3;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  vfloat4 a0_1;
  undefined1 auVar247 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar246 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar256;
  float fVar266;
  float fVar267;
  vfloat4 a0;
  undefined1 auVar257 [16];
  float fVar268;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar271 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_720 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined4 local_560;
  undefined4 local_550;
  uint auStack_520 [4];
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar49;
  undefined1 auVar281 [32];
  
  PVar2 = prim[1];
  uVar48 = (ulong)(byte)PVar2;
  fVar59 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar61._0_4_ = fVar59 * auVar7._0_4_;
  auVar61._4_4_ = fVar59 * auVar7._4_4_;
  auVar61._8_4_ = fVar59 * auVar7._8_4_;
  auVar61._12_4_ = fVar59 * auVar7._12_4_;
  auVar145._0_4_ = fVar59 * auVar8._0_4_;
  auVar145._4_4_ = fVar59 * auVar8._4_4_;
  auVar145._8_4_ = fVar59 * auVar8._8_4_;
  auVar145._12_4_ = fVar59 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xc + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xd + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x12 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x13 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x14 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar269._4_4_ = auVar145._0_4_;
  auVar269._0_4_ = auVar145._0_4_;
  auVar269._8_4_ = auVar145._0_4_;
  auVar269._12_4_ = auVar145._0_4_;
  auVar91 = vshufps_avx(auVar145,auVar145,0x55);
  auVar62 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar59 = auVar62._0_4_;
  auVar225._0_4_ = fVar59 * auVar127._0_4_;
  fVar84 = auVar62._4_4_;
  auVar225._4_4_ = fVar84 * auVar127._4_4_;
  fVar86 = auVar62._8_4_;
  auVar225._8_4_ = fVar86 * auVar127._8_4_;
  fVar120 = auVar62._12_4_;
  auVar225._12_4_ = fVar120 * auVar127._12_4_;
  auVar209._0_4_ = auVar12._0_4_ * fVar59;
  auVar209._4_4_ = auVar12._4_4_ * fVar84;
  auVar209._8_4_ = auVar12._8_4_ * fVar86;
  auVar209._12_4_ = auVar12._12_4_ * fVar120;
  auVar240._0_4_ = auVar110._0_4_ * fVar59;
  auVar240._4_4_ = auVar110._4_4_ * fVar84;
  auVar240._8_4_ = auVar110._8_4_ * fVar86;
  auVar240._12_4_ = auVar110._12_4_ * fVar120;
  auVar62 = vfmadd231ps_fma(auVar225,auVar91,auVar8);
  auVar111 = vfmadd231ps_fma(auVar209,auVar91,auVar11);
  auVar91 = vfmadd231ps_fma(auVar240,auVar63,auVar91);
  auVar121 = vfmadd231ps_fma(auVar62,auVar269,auVar7);
  auVar111 = vfmadd231ps_fma(auVar111,auVar269,auVar10);
  auVar135 = vfmadd231ps_fma(auVar91,auVar64,auVar269);
  auVar270._4_4_ = auVar61._0_4_;
  auVar270._0_4_ = auVar61._0_4_;
  auVar270._8_4_ = auVar61._0_4_;
  auVar270._12_4_ = auVar61._0_4_;
  auVar91 = vshufps_avx(auVar61,auVar61,0x55);
  auVar62 = vshufps_avx(auVar61,auVar61,0xaa);
  fVar59 = auVar62._0_4_;
  auVar146._0_4_ = fVar59 * auVar127._0_4_;
  fVar84 = auVar62._4_4_;
  auVar146._4_4_ = fVar84 * auVar127._4_4_;
  fVar86 = auVar62._8_4_;
  auVar146._8_4_ = fVar86 * auVar127._8_4_;
  fVar120 = auVar62._12_4_;
  auVar146._12_4_ = fVar120 * auVar127._12_4_;
  auVar90._0_4_ = auVar12._0_4_ * fVar59;
  auVar90._4_4_ = auVar12._4_4_ * fVar84;
  auVar90._8_4_ = auVar12._8_4_ * fVar86;
  auVar90._12_4_ = auVar12._12_4_ * fVar120;
  auVar62._0_4_ = auVar110._0_4_ * fVar59;
  auVar62._4_4_ = auVar110._4_4_ * fVar84;
  auVar62._8_4_ = auVar110._8_4_ * fVar86;
  auVar62._12_4_ = auVar110._12_4_ * fVar120;
  auVar8 = vfmadd231ps_fma(auVar146,auVar91,auVar8);
  auVar127 = vfmadd231ps_fma(auVar90,auVar91,auVar11);
  auVar11 = vfmadd231ps_fma(auVar62,auVar91,auVar63);
  auVar12 = vfmadd231ps_fma(auVar8,auVar270,auVar7);
  auVar63 = vfmadd231ps_fma(auVar127,auVar270,auVar10);
  auVar110 = vfmadd231ps_fma(auVar11,auVar270,auVar64);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar121,auVar238);
  auVar247._8_4_ = 0x219392ef;
  auVar247._0_8_ = 0x219392ef219392ef;
  auVar247._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar247,1);
  auVar8 = vblendvps_avx(auVar121,auVar247,auVar7);
  auVar7 = vandps_avx(auVar111,auVar238);
  auVar7 = vcmpps_avx(auVar7,auVar247,1);
  auVar127 = vblendvps_avx(auVar111,auVar247,auVar7);
  auVar7 = vandps_avx(auVar238,auVar135);
  auVar7 = vcmpps_avx(auVar7,auVar247,1);
  auVar7 = vblendvps_avx(auVar135,auVar247,auVar7);
  auVar10 = vrcpps_avx(auVar8);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = 0x3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar10,auVar183);
  auVar10 = vfmadd132ps_fma(auVar8,auVar10,auVar10);
  auVar8 = vrcpps_avx(auVar127);
  auVar127 = vfnmadd213ps_fma(auVar127,auVar8,auVar183);
  auVar11 = vfmadd132ps_fma(auVar127,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar127 = vfnmadd213ps_fma(auVar7,auVar8,auVar183);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar64 = vfmadd132ps_fma(auVar127,auVar8,auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar135._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar135._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar135._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar135._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vsubps_avx(auVar7,auVar12);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar48 * 0xe + 6);
  auVar7 = vpmovsxwd_avx(auVar127);
  auVar147._0_4_ = auVar10._0_4_ * auVar8._0_4_;
  auVar147._4_4_ = auVar10._4_4_ * auVar8._4_4_;
  auVar147._8_4_ = auVar10._8_4_ * auVar8._8_4_;
  auVar147._12_4_ = auVar10._12_4_ * auVar8._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar63);
  auVar163._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar163._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar163._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar163._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  auVar111._1_3_ = 0;
  auVar111[0] = PVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar63);
  auVar91._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar91._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar91._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar91._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar48 * 0x15 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vsubps_avx(auVar7,auVar110);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar12);
  auVar121._0_4_ = auVar64._0_4_ * auVar8._0_4_;
  auVar121._4_4_ = auVar64._4_4_ * auVar8._4_4_;
  auVar121._8_4_ = auVar64._8_4_ * auVar8._8_4_;
  auVar121._12_4_ = auVar64._12_4_ * auVar8._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar110);
  auVar63._0_4_ = auVar64._0_4_ * auVar7._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar7._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar7._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar135,auVar147);
  auVar8 = vpminsd_avx(auVar163,auVar91);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar121,auVar63);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar124._4_4_ = uVar56;
  auVar124._0_4_ = uVar56;
  auVar124._8_4_ = uVar56;
  auVar124._12_4_ = uVar56;
  auVar8 = vmaxps_avx(auVar8,auVar124);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_450._0_4_ = auVar7._0_4_ * 0.99999964;
  local_450._4_4_ = auVar7._4_4_ * 0.99999964;
  local_450._8_4_ = auVar7._8_4_ * 0.99999964;
  local_450._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar135,auVar147);
  auVar8 = vpmaxsd_avx(auVar163,auVar91);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar121,auVar63);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar110._4_4_ = uVar56;
  auVar110._0_4_ = uVar56;
  auVar110._8_4_ = uVar56;
  auVar110._12_4_ = uVar56;
  auVar8 = vminps_avx(auVar8,auVar110);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar111[4] = PVar2;
  auVar111._5_3_ = 0;
  auVar111[8] = PVar2;
  auVar111._9_3_ = 0;
  auVar111[0xc] = PVar2;
  auVar111._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar111,_DAT_01f4ad30);
  auVar64._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar7 = vcmpps_avx(local_450,auVar64,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  uVar56 = vmovmskps_avx(auVar7);
  uVar48 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar56);
  auVar80._16_16_ = mm_lookupmask_ps._240_16_;
  auVar80._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar80,ZEXT832(0) << 0x20,0x80);
  iVar45 = 1 << ((uint)k & 0x1f);
  auVar81._4_4_ = iVar45;
  auVar81._0_4_ = iVar45;
  auVar81._8_4_ = iVar45;
  auVar81._12_4_ = iVar45;
  auVar81._16_4_ = iVar45;
  auVar81._20_4_ = iVar45;
  auVar81._24_4_ = iVar45;
  auVar81._28_4_ = iVar45;
  auVar14 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar80 = vpand_avx2(auVar81,auVar14);
  local_360 = vpcmpeqd_avx2(auVar80,auVar14);
LAB_0110df7f:
  if (uVar48 == 0) {
LAB_0110fbc7:
    return uVar48 != 0;
  }
  lVar50 = 0;
  for (uVar53 = uVar48; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar47 = *(uint *)(prim + 2);
  local_340 = *(uint *)(prim + lVar50 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar47].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_340);
  p_Var4 = pGVar3[1].intersectionFilterN;
  pvVar5 = pGVar3[2].userPtr;
  _Var6 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar7 = *(undefined1 (*) [16])(_Var6 + uVar53 * (long)pvVar5);
  auVar8 = *(undefined1 (*) [16])(_Var6 + (uVar53 + 1) * (long)pvVar5);
  auVar127 = *(undefined1 (*) [16])(_Var6 + (uVar53 + 2) * (long)pvVar5);
  auVar10 = *(undefined1 (*) [16])(_Var6 + (long)pvVar5 * (uVar53 + 3));
  lVar50 = *(long *)&pGVar3[1].time_range.upper;
  auVar11 = *(undefined1 (*) [16])(lVar50 + (long)p_Var4 * uVar53);
  auVar12 = *(undefined1 (*) [16])(lVar50 + (long)p_Var4 * (uVar53 + 1));
  auVar64 = *(undefined1 (*) [16])(lVar50 + (long)p_Var4 * (uVar53 + 2));
  uVar58 = uVar48 - 1 & uVar48;
  auVar63 = *(undefined1 (*) [16])(lVar50 + (long)p_Var4 * (uVar53 + 3));
  if (uVar58 != 0) {
    uVar55 = uVar58 - 1 & uVar58;
    for (uVar53 = uVar58; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar135 = ZEXT816(0) << 0x40;
  auVar92._0_4_ = auVar63._0_4_ * 0.0;
  auVar92._4_4_ = auVar63._4_4_ * 0.0;
  auVar92._8_4_ = auVar63._8_4_ * 0.0;
  auVar92._12_4_ = auVar63._12_4_ * 0.0;
  auVar62 = vfmadd231ps_fma(auVar92,auVar64,auVar135);
  auVar91 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar62);
  local_7a0._0_4_ = auVar11._0_4_ + auVar91._0_4_;
  local_7a0._4_4_ = auVar11._4_4_ + auVar91._4_4_;
  uStack_798._0_4_ = auVar11._8_4_ + auVar91._8_4_;
  uStack_798._4_4_ = auVar11._12_4_ + auVar91._12_4_;
  auVar271._8_4_ = 0x40400000;
  auVar271._0_8_ = 0x4040000040400000;
  auVar271._12_4_ = 0x40400000;
  auVar91 = vfmadd231ps_fma(auVar62,auVar12,auVar271);
  auVar111 = vfnmadd231ps_fma(auVar91,auVar11,auVar271);
  auVar244._0_4_ = auVar10._0_4_ * 0.0;
  auVar244._4_4_ = auVar10._4_4_ * 0.0;
  auVar244._8_4_ = auVar10._8_4_ * 0.0;
  auVar244._12_4_ = auVar10._12_4_ * 0.0;
  auVar62 = vfmadd231ps_fma(auVar244,auVar127,auVar135);
  auVar91 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar8,auVar62);
  auVar257._0_4_ = auVar7._0_4_ + auVar91._0_4_;
  auVar257._4_4_ = auVar7._4_4_ + auVar91._4_4_;
  auVar257._8_4_ = auVar7._8_4_ + auVar91._8_4_;
  auVar257._12_4_ = auVar7._12_4_ + auVar91._12_4_;
  auVar91 = vfmadd231ps_fma(auVar62,auVar8,auVar271);
  auVar62 = vfnmadd231ps_fma(auVar91,auVar7,auVar271);
  auVar91 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar64,auVar63);
  auVar91 = vfmadd231ps_fma(auVar91,auVar12,auVar135);
  auVar91 = vfmadd231ps_fma(auVar91,auVar11,auVar135);
  auVar136._0_4_ = auVar63._0_4_ * 3.0;
  auVar136._4_4_ = auVar63._4_4_ * 3.0;
  auVar136._8_4_ = auVar63._8_4_ * 3.0;
  auVar136._12_4_ = auVar63._12_4_ * 3.0;
  auVar64 = vfnmadd231ps_fma(auVar136,auVar271,auVar64);
  auVar12 = vfmadd231ps_fma(auVar64,auVar135,auVar12);
  auVar121 = vfnmadd231ps_fma(auVar12,auVar135,auVar11);
  auVar11 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar127,auVar10);
  auVar11 = vfmadd231ps_fma(auVar11,auVar8,auVar135);
  auVar11 = vfmadd231ps_fma(auVar11,auVar7,auVar135);
  auVar226._0_4_ = auVar10._0_4_ * 3.0;
  auVar226._4_4_ = auVar10._4_4_ * 3.0;
  auVar226._8_4_ = auVar10._8_4_ * 3.0;
  auVar226._12_4_ = auVar10._12_4_ * 3.0;
  auVar127 = vfnmadd231ps_fma(auVar226,auVar271,auVar127);
  auVar8 = vfmadd231ps_fma(auVar127,auVar135,auVar8);
  auVar12 = vfnmadd231ps_fma(auVar8,auVar135,auVar7);
  auVar7 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar8 = vshufps_avx(auVar257,auVar257,0xc9);
  fVar85 = auVar111._0_4_;
  auVar164._0_4_ = fVar85 * auVar8._0_4_;
  fVar87 = auVar111._4_4_;
  auVar164._4_4_ = fVar87 * auVar8._4_4_;
  fVar162 = auVar111._8_4_;
  auVar164._8_4_ = fVar162 * auVar8._8_4_;
  fVar60 = auVar111._12_4_;
  auVar164._12_4_ = fVar60 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar164,auVar7,auVar257);
  auVar127 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar165._0_4_ = fVar85 * auVar8._0_4_;
  auVar165._4_4_ = fVar87 * auVar8._4_4_;
  auVar165._8_4_ = fVar162 * auVar8._8_4_;
  auVar165._12_4_ = fVar60 * auVar8._12_4_;
  auVar7 = vfmsub231ps_fma(auVar165,auVar7,auVar62);
  auVar10 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar8 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar7 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar224 = auVar121._0_4_;
  auVar148._0_4_ = fVar224 * auVar7._0_4_;
  fVar134 = auVar121._4_4_;
  auVar148._4_4_ = fVar134 * auVar7._4_4_;
  fVar143 = auVar121._8_4_;
  auVar148._8_4_ = fVar143 * auVar7._8_4_;
  fVar144 = auVar121._12_4_;
  auVar148._12_4_ = fVar144 * auVar7._12_4_;
  auVar7 = vfmsub231ps_fma(auVar148,auVar8,auVar11);
  auVar11 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar184._0_4_ = fVar224 * auVar7._0_4_;
  auVar184._4_4_ = fVar134 * auVar7._4_4_;
  auVar184._8_4_ = fVar143 * auVar7._8_4_;
  auVar184._12_4_ = fVar144 * auVar7._12_4_;
  auVar7 = vdpps_avx(auVar127,auVar127,0x7f);
  auVar8 = vfmsub231ps_fma(auVar184,auVar8,auVar12);
  auVar12 = vshufps_avx(auVar8,auVar8,0xc9);
  fVar84 = auVar7._0_4_;
  auVar227._4_12_ = ZEXT812(0) << 0x20;
  auVar227._0_4_ = fVar84;
  auVar8 = vrsqrtss_avx(auVar227,auVar227);
  fVar59 = auVar8._0_4_;
  fVar86 = fVar59 * 1.5 - fVar84 * 0.5 * fVar59 * fVar59 * fVar59;
  fVar161 = auVar127._0_4_ * fVar86;
  fVar180 = auVar127._4_4_ * fVar86;
  fVar181 = auVar127._8_4_ * fVar86;
  fVar182 = auVar127._12_4_ * fVar86;
  auVar8 = vdpps_avx(auVar127,auVar10,0x7f);
  auVar239._0_4_ = auVar10._0_4_ * fVar84;
  auVar239._4_4_ = auVar10._4_4_ * fVar84;
  auVar239._8_4_ = auVar10._8_4_ * fVar84;
  auVar239._12_4_ = auVar10._12_4_ * fVar84;
  fVar59 = auVar8._0_4_;
  auVar198._0_4_ = auVar127._0_4_ * fVar59;
  auVar198._4_4_ = auVar127._4_4_ * fVar59;
  auVar198._8_4_ = auVar127._8_4_ * fVar59;
  auVar198._12_4_ = auVar127._12_4_ * fVar59;
  auVar127 = vsubps_avx(auVar239,auVar198);
  auVar8 = vrcpss_avx(auVar227,auVar227);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar59 = auVar8._0_4_ * auVar7._0_4_;
  auVar7 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar84 = auVar7._0_4_;
  auVar210._4_12_ = ZEXT812(0) << 0x20;
  auVar210._0_4_ = fVar84;
  auVar8 = vrsqrtss_avx(auVar210,auVar210);
  fVar120 = auVar8._0_4_;
  fVar120 = fVar120 * 1.5 - fVar84 * 0.5 * fVar120 * fVar120 * fVar120;
  auVar8 = vdpps_avx(auVar11,auVar12,0x7f);
  fVar256 = fVar120 * auVar11._0_4_;
  fVar266 = fVar120 * auVar11._4_4_;
  fVar267 = fVar120 * auVar11._8_4_;
  fVar268 = fVar120 * auVar11._12_4_;
  auVar185._0_4_ = fVar84 * auVar12._0_4_;
  auVar185._4_4_ = fVar84 * auVar12._4_4_;
  auVar185._8_4_ = fVar84 * auVar12._8_4_;
  auVar185._12_4_ = fVar84 * auVar12._12_4_;
  fVar84 = auVar8._0_4_;
  auVar149._0_4_ = fVar84 * auVar11._0_4_;
  auVar149._4_4_ = fVar84 * auVar11._4_4_;
  auVar149._8_4_ = fVar84 * auVar11._8_4_;
  auVar149._12_4_ = fVar84 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar185,auVar149);
  auVar8 = vrcpss_avx(auVar210,auVar210);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,ZEXT416(0x40000000));
  fVar84 = auVar7._0_4_ * auVar8._0_4_;
  auVar7 = vshufps_avx(_local_7a0,_local_7a0,0xff);
  auVar211._0_4_ = auVar7._0_4_ * fVar161;
  auVar211._4_4_ = auVar7._4_4_ * fVar180;
  auVar211._8_4_ = auVar7._8_4_ * fVar181;
  auVar211._12_4_ = auVar7._12_4_ * fVar182;
  auVar64 = vsubps_avx(_local_7a0,auVar211);
  auVar8 = vshufps_avx(auVar111,auVar111,0xff);
  auVar166._0_4_ = auVar8._0_4_ * fVar161 + fVar86 * auVar127._0_4_ * fVar59 * auVar7._0_4_;
  auVar166._4_4_ = auVar8._4_4_ * fVar180 + fVar86 * auVar127._4_4_ * fVar59 * auVar7._4_4_;
  auVar166._8_4_ = auVar8._8_4_ * fVar181 + fVar86 * auVar127._8_4_ * fVar59 * auVar7._8_4_;
  auVar166._12_4_ = auVar8._12_4_ * fVar182 + fVar86 * auVar127._12_4_ * fVar59 * auVar7._12_4_;
  auVar127 = vsubps_avx(auVar111,auVar166);
  auVar228._0_4_ = auVar211._0_4_ + (float)local_7a0._0_4_;
  auVar228._4_4_ = auVar211._4_4_ + (float)local_7a0._4_4_;
  auVar228._8_4_ = auVar211._8_4_ + (float)uStack_798;
  auVar228._12_4_ = auVar211._12_4_ + uStack_798._4_4_;
  auVar7 = vshufps_avx(auVar91,auVar91,0xff);
  auVar112._0_4_ = fVar256 * auVar7._0_4_;
  auVar112._4_4_ = fVar266 * auVar7._4_4_;
  auVar112._8_4_ = fVar267 * auVar7._8_4_;
  auVar112._12_4_ = fVar268 * auVar7._12_4_;
  auVar63 = vsubps_avx(auVar91,auVar112);
  auVar8 = vshufps_avx(auVar121,auVar121,0xff);
  auVar93._0_4_ = fVar256 * auVar8._0_4_ + auVar7._0_4_ * fVar120 * auVar10._0_4_ * fVar84;
  auVar93._4_4_ = fVar266 * auVar8._4_4_ + auVar7._4_4_ * fVar120 * auVar10._4_4_ * fVar84;
  auVar93._8_4_ = fVar267 * auVar8._8_4_ + auVar7._8_4_ * fVar120 * auVar10._8_4_ * fVar84;
  auVar93._12_4_ = fVar268 * auVar8._12_4_ + auVar7._12_4_ * fVar120 * auVar10._12_4_ * fVar84;
  auVar7 = vsubps_avx(auVar121,auVar93);
  fVar161 = auVar91._0_4_ + auVar112._0_4_;
  fVar180 = auVar91._4_4_ + auVar112._4_4_;
  fVar181 = auVar91._8_4_ + auVar112._8_4_;
  fVar182 = auVar91._12_4_ + auVar112._12_4_;
  auVar122._0_4_ = auVar64._0_4_ + auVar127._0_4_ * 0.33333334;
  auVar122._4_4_ = auVar64._4_4_ + auVar127._4_4_ * 0.33333334;
  auVar122._8_4_ = auVar64._8_4_ + auVar127._8_4_ * 0.33333334;
  auVar122._12_4_ = auVar64._12_4_ + auVar127._12_4_ * 0.33333334;
  auVar94._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar94._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar94._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar94._12_4_ = auVar7._12_4_ * 0.33333334;
  auVar91 = vsubps_avx(auVar63,auVar94);
  auVar62 = vsubps_avx(auVar64,auVar110);
  auVar7 = vshufps_avx(auVar62,auVar62,0x55);
  auVar8 = vshufps_avx(auVar62,auVar62,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar59 = pre->ray_space[k].vz.field_0.m128[0];
  fVar84 = pre->ray_space[k].vz.field_0.m128[1];
  fVar86 = pre->ray_space[k].vz.field_0.m128[2];
  fVar120 = pre->ray_space[k].vz.field_0.m128[3];
  auVar95._0_4_ = fVar59 * auVar8._0_4_;
  auVar95._4_4_ = fVar84 * auVar8._4_4_;
  auVar95._8_4_ = fVar86 * auVar8._8_4_;
  auVar95._12_4_ = fVar120 * auVar8._12_4_;
  auVar127 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar1,auVar7);
  auVar111 = vsubps_avx(auVar122,auVar110);
  auVar7 = vshufps_avx(auVar111,auVar111,0x55);
  auVar8 = vshufps_avx(auVar111,auVar111,0xaa);
  auVar277._0_4_ = fVar59 * auVar8._0_4_;
  auVar277._4_4_ = fVar84 * auVar8._4_4_;
  auVar277._8_4_ = fVar86 * auVar8._8_4_;
  auVar277._12_4_ = fVar120 * auVar8._12_4_;
  auVar8 = vfmadd231ps_fma(auVar277,(undefined1  [16])aVar1,auVar7);
  local_3e0 = vsubps_avx(auVar91,auVar110);
  auVar7 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar245._0_4_ = fVar59 * auVar7._0_4_;
  auVar245._4_4_ = fVar84 * auVar7._4_4_;
  auVar245._8_4_ = fVar86 * auVar7._8_4_;
  auVar245._12_4_ = fVar120 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar10 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar1,auVar7);
  local_3f0 = vsubps_avx(auVar63,auVar110);
  auVar7 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar258._0_4_ = fVar59 * auVar7._0_4_;
  auVar258._4_4_ = fVar84 * auVar7._4_4_;
  auVar258._8_4_ = fVar86 * auVar7._8_4_;
  auVar258._12_4_ = fVar120 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar11 = vfmadd231ps_fma(auVar258,(undefined1  [16])aVar1,auVar7);
  local_400 = vsubps_avx(auVar228,auVar110);
  auVar7 = vshufps_avx(local_400,local_400,0xaa);
  auVar150._0_4_ = fVar59 * auVar7._0_4_;
  auVar150._4_4_ = fVar84 * auVar7._4_4_;
  auVar150._8_4_ = fVar86 * auVar7._8_4_;
  auVar150._12_4_ = fVar120 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_400,local_400,0x55);
  auVar12 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar1,auVar7);
  auVar65._0_4_ = (fVar85 + auVar166._0_4_) * 0.33333334 + auVar228._0_4_;
  auVar65._4_4_ = (fVar87 + auVar166._4_4_) * 0.33333334 + auVar228._4_4_;
  auVar65._8_4_ = (fVar162 + auVar166._8_4_) * 0.33333334 + auVar228._8_4_;
  auVar65._12_4_ = (fVar60 + auVar166._12_4_) * 0.33333334 + auVar228._12_4_;
  local_410 = vsubps_avx(auVar65,auVar110);
  auVar7 = vshufps_avx(local_410,local_410,0xaa);
  auVar199._0_4_ = auVar7._0_4_ * fVar59;
  auVar199._4_4_ = auVar7._4_4_ * fVar84;
  auVar199._8_4_ = auVar7._8_4_ * fVar86;
  auVar199._12_4_ = auVar7._12_4_ * fVar120;
  auVar7 = vshufps_avx(local_410,local_410,0x55);
  auVar135 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar1,auVar7);
  auVar212._0_4_ = (fVar224 + auVar93._0_4_) * 0.33333334;
  auVar212._4_4_ = (fVar134 + auVar93._4_4_) * 0.33333334;
  auVar212._8_4_ = (fVar143 + auVar93._8_4_) * 0.33333334;
  auVar212._12_4_ = (fVar144 + auVar93._12_4_) * 0.33333334;
  auVar19._4_4_ = fVar180;
  auVar19._0_4_ = fVar161;
  auVar19._8_4_ = fVar181;
  auVar19._12_4_ = fVar182;
  auVar121 = vsubps_avx(auVar19,auVar212);
  local_420 = vsubps_avx(auVar121,auVar110);
  auVar7 = vshufps_avx(local_420,local_420,0xaa);
  auVar213._0_4_ = auVar7._0_4_ * fVar59;
  auVar213._4_4_ = auVar7._4_4_ * fVar84;
  auVar213._8_4_ = auVar7._8_4_ * fVar86;
  auVar213._12_4_ = auVar7._12_4_ * fVar120;
  auVar7 = vshufps_avx(local_420,local_420,0x55);
  auVar61 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar1,auVar7);
  local_430 = vsubps_avx(auVar19,auVar110);
  auVar7 = vshufps_avx(local_430,local_430,0xaa);
  auVar66._0_4_ = fVar59 * auVar7._0_4_;
  auVar66._4_4_ = fVar84 * auVar7._4_4_;
  auVar66._8_4_ = fVar86 * auVar7._8_4_;
  auVar66._12_4_ = fVar120 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_430,local_430,0x55);
  auVar7 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar1,auVar7);
  local_550 = auVar62._0_4_;
  auVar167._4_4_ = local_550;
  auVar167._0_4_ = local_550;
  auVar167._8_4_ = local_550;
  auVar167._12_4_ = local_550;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar110 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar1,auVar167);
  local_560 = auVar111._0_4_;
  auVar168._4_4_ = local_560;
  auVar168._0_4_ = local_560;
  auVar168._8_4_ = local_560;
  auVar168._12_4_ = local_560;
  auVar90 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar168);
  uVar56 = local_3e0._0_4_;
  auVar169._4_4_ = uVar56;
  auVar169._0_4_ = uVar56;
  auVar169._8_4_ = uVar56;
  auVar169._12_4_ = uVar56;
  auVar247 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar169);
  uVar56 = local_3f0._0_4_;
  auVar170._4_4_ = uVar56;
  auVar170._0_4_ = uVar56;
  auVar170._8_4_ = uVar56;
  auVar170._12_4_ = uVar56;
  auVar145 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar170);
  uVar56 = local_400._0_4_;
  auVar171._4_4_ = uVar56;
  auVar171._0_4_ = uVar56;
  auVar171._8_4_ = uVar56;
  auVar171._12_4_ = uVar56;
  auVar146 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar1,auVar171);
  uVar56 = local_410._0_4_;
  auVar172._4_4_ = uVar56;
  auVar172._0_4_ = uVar56;
  auVar172._8_4_ = uVar56;
  auVar172._12_4_ = uVar56;
  auVar135 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar1,auVar172);
  uVar56 = local_420._0_4_;
  auVar173._4_4_ = uVar56;
  auVar173._0_4_ = uVar56;
  auVar173._8_4_ = uVar56;
  auVar173._12_4_ = uVar56;
  auVar61 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar173);
  uVar56 = local_430._0_4_;
  auVar174._4_4_ = uVar56;
  auVar174._0_4_ = uVar56;
  auVar174._8_4_ = uVar56;
  auVar174._12_4_ = uVar56;
  auVar147 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar1,auVar174);
  auVar10 = vmovlhps_avx(auVar110,auVar146);
  auVar11 = vmovlhps_avx(auVar90,auVar135);
  auVar12 = vmovlhps_avx(auVar247,auVar61);
  _local_3c0 = vmovlhps_avx(auVar145,auVar147);
  auVar7 = vminps_avx(auVar10,auVar11);
  auVar8 = vminps_avx(auVar12,_local_3c0);
  auVar127 = vminps_avx(auVar7,auVar8);
  auVar7 = vmaxps_avx(auVar10,auVar11);
  auVar8 = vmaxps_avx(auVar12,_local_3c0);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vshufpd_avx(auVar127,auVar127,3);
  auVar127 = vminps_avx(auVar127,auVar8);
  auVar8 = vshufpd_avx(auVar7,auVar7,3);
  auVar8 = vmaxps_avx(auVar7,auVar8);
  auVar7 = vandps_avx(auVar238,auVar127);
  auVar8 = vandps_avx(auVar238,auVar8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(auVar8,auVar7);
  local_1c0 = auVar7._0_4_ * 9.536743e-07;
  auVar186._8_8_ = auVar110._0_8_;
  auVar186._0_8_ = auVar110._0_8_;
  auVar229._8_8_ = auVar90._0_8_;
  auVar229._0_8_ = auVar90._0_8_;
  auVar246._0_8_ = auVar247._0_8_;
  auVar246._8_8_ = auVar246._0_8_;
  auVar259._0_8_ = auVar145._0_8_;
  auVar259._8_8_ = auVar259._0_8_;
  local_3d0 = ZEXT416((uint)local_1c0);
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar47;
  uStack_31c = uVar47;
  uStack_318 = uVar47;
  uStack_314 = uVar47;
  uStack_310 = uVar47;
  uStack_30c = uVar47;
  uStack_308 = uVar47;
  uStack_304 = uVar47;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  bVar57 = false;
  uVar53 = 0;
  fVar59 = *(float *)(ray + k * 4 + 0x60);
  local_390 = vsubps_avx(auVar11,auVar10);
  local_3a0 = vsubps_avx(auVar12,auVar11);
  local_3b0 = vsubps_avx(_local_3c0,auVar12);
  local_460 = vsubps_avx(auVar228,auVar64);
  local_470 = vsubps_avx(auVar65,auVar122);
  local_480 = vsubps_avx(auVar121,auVar91);
  auVar20._4_4_ = fVar180;
  auVar20._0_4_ = fVar161;
  auVar20._8_4_ = fVar181;
  auVar20._12_4_ = fVar182;
  _local_490 = vsubps_avx(auVar20,auVar63);
  auVar67 = ZEXT816(0x3f80000000000000);
  local_440 = auVar67;
LAB_0110e748:
  auVar7 = vshufps_avx(auVar67,auVar67,0x50);
  auVar278._8_4_ = 0x3f800000;
  auVar278._0_8_ = 0x3f8000003f800000;
  auVar278._12_4_ = 0x3f800000;
  auVar281._16_4_ = 0x3f800000;
  auVar281._0_16_ = auVar278;
  auVar281._20_4_ = 0x3f800000;
  auVar281._24_4_ = 0x3f800000;
  auVar281._28_4_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar278,auVar7);
  fVar84 = auVar7._0_4_;
  fVar134 = auVar146._0_4_;
  auVar68._0_4_ = fVar134 * fVar84;
  fVar86 = auVar7._4_4_;
  fVar143 = auVar146._4_4_;
  auVar68._4_4_ = fVar143 * fVar86;
  fVar120 = auVar7._8_4_;
  auVar68._8_4_ = fVar134 * fVar120;
  fVar85 = auVar7._12_4_;
  auVar68._12_4_ = fVar143 * fVar85;
  fVar144 = auVar135._0_4_;
  auVar175._0_4_ = fVar144 * fVar84;
  fVar256 = auVar135._4_4_;
  auVar175._4_4_ = fVar256 * fVar86;
  auVar175._8_4_ = fVar144 * fVar120;
  auVar175._12_4_ = fVar256 * fVar85;
  fVar197 = auVar61._0_4_;
  auVar137._0_4_ = fVar197 * fVar84;
  fVar207 = auVar61._4_4_;
  auVar137._4_4_ = fVar207 * fVar86;
  auVar137._8_4_ = fVar197 * fVar120;
  auVar137._12_4_ = fVar207 * fVar85;
  fVar208 = auVar147._0_4_;
  auVar113._0_4_ = fVar208 * fVar84;
  fVar223 = auVar147._4_4_;
  auVar113._4_4_ = fVar223 * fVar86;
  auVar113._8_4_ = fVar208 * fVar120;
  auVar113._12_4_ = fVar223 * fVar85;
  auVar90 = vfmadd231ps_fma(auVar68,auVar8,auVar186);
  auVar247 = vfmadd231ps_fma(auVar175,auVar8,auVar229);
  auVar145 = vfmadd231ps_fma(auVar137,auVar8,auVar246);
  auVar163 = vfmadd231ps_fma(auVar113,auVar259,auVar8);
  auVar7 = vmovshdup_avx(local_440);
  fVar84 = local_440._0_4_;
  fStack_288 = (auVar7._0_4_ - fVar84) * 0.04761905;
  auVar221._4_4_ = fVar84;
  auVar221._0_4_ = fVar84;
  auVar221._8_4_ = fVar84;
  auVar221._12_4_ = fVar84;
  auVar221._16_4_ = fVar84;
  auVar221._20_4_ = fVar84;
  auVar221._24_4_ = fVar84;
  auVar221._28_4_ = fVar84;
  auVar105._0_8_ = auVar7._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  auVar80 = vsubps_avx(auVar105,auVar221);
  uVar56 = auVar90._0_4_;
  auVar275._4_4_ = uVar56;
  auVar275._0_4_ = uVar56;
  auVar275._8_4_ = uVar56;
  auVar275._12_4_ = uVar56;
  auVar275._16_4_ = uVar56;
  auVar275._20_4_ = uVar56;
  auVar275._24_4_ = uVar56;
  auVar275._28_4_ = uVar56;
  auVar7 = vmovshdup_avx(auVar90);
  uVar89 = auVar7._0_8_;
  auVar265._8_8_ = uVar89;
  auVar265._0_8_ = uVar89;
  auVar265._16_8_ = uVar89;
  auVar265._24_8_ = uVar89;
  fVar266 = auVar247._0_4_;
  auVar253._4_4_ = fVar266;
  auVar253._0_4_ = fVar266;
  auVar253._8_4_ = fVar266;
  auVar253._12_4_ = fVar266;
  auVar253._16_4_ = fVar266;
  auVar253._20_4_ = fVar266;
  auVar253._24_4_ = fVar266;
  auVar253._28_4_ = fVar266;
  auVar8 = vmovshdup_avx(auVar247);
  auVar106._0_8_ = auVar8._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  fVar224 = auVar145._0_4_;
  auVar190._4_4_ = fVar224;
  auVar190._0_4_ = fVar224;
  auVar190._8_4_ = fVar224;
  auVar190._12_4_ = fVar224;
  auVar190._16_4_ = fVar224;
  auVar190._20_4_ = fVar224;
  auVar190._24_4_ = fVar224;
  auVar190._28_4_ = fVar224;
  auVar127 = vmovshdup_avx(auVar145);
  auVar205._0_8_ = auVar127._0_8_;
  auVar205._8_8_ = auVar205._0_8_;
  auVar205._16_8_ = auVar205._0_8_;
  auVar205._24_8_ = auVar205._0_8_;
  fVar60 = auVar163._0_4_;
  auVar110 = vmovshdup_avx(auVar163);
  auVar240 = vfmadd132ps_fma(auVar80,auVar221,_DAT_01f7b040);
  auVar80 = vsubps_avx(auVar281,ZEXT1632(auVar240));
  fVar84 = auVar240._0_4_;
  fVar86 = auVar240._4_4_;
  auVar14._4_4_ = fVar266 * fVar86;
  auVar14._0_4_ = fVar266 * fVar84;
  fVar120 = auVar240._8_4_;
  auVar14._8_4_ = fVar266 * fVar120;
  fVar85 = auVar240._12_4_;
  auVar14._12_4_ = fVar266 * fVar85;
  auVar14._16_4_ = fVar266 * 0.0;
  auVar14._20_4_ = fVar266 * 0.0;
  auVar14._24_4_ = fVar266 * 0.0;
  auVar14._28_4_ = 0x3f800000;
  auVar240 = vfmadd231ps_fma(auVar14,auVar80,auVar275);
  fVar87 = auVar8._0_4_;
  fVar162 = auVar8._4_4_;
  auVar13._4_4_ = fVar162 * fVar86;
  auVar13._0_4_ = fVar87 * fVar84;
  auVar13._8_4_ = fVar87 * fVar120;
  auVar13._12_4_ = fVar162 * fVar85;
  auVar13._16_4_ = fVar87 * 0.0;
  auVar13._20_4_ = fVar162 * 0.0;
  auVar13._24_4_ = fVar87 * 0.0;
  auVar13._28_4_ = uVar56;
  auVar183 = vfmadd231ps_fma(auVar13,auVar80,auVar265);
  auVar9._4_4_ = fVar224 * fVar86;
  auVar9._0_4_ = fVar224 * fVar84;
  auVar9._8_4_ = fVar224 * fVar120;
  auVar9._12_4_ = fVar224 * fVar85;
  auVar9._16_4_ = fVar224 * 0.0;
  auVar9._20_4_ = fVar224 * 0.0;
  auVar9._24_4_ = fVar224 * 0.0;
  auVar9._28_4_ = auVar7._4_4_;
  auVar209 = vfmadd231ps_fma(auVar9,auVar80,auVar253);
  fVar87 = auVar127._0_4_;
  fVar162 = auVar127._4_4_;
  auVar15._4_4_ = fVar162 * fVar86;
  auVar15._0_4_ = fVar87 * fVar84;
  auVar15._8_4_ = fVar87 * fVar120;
  auVar15._12_4_ = fVar162 * fVar85;
  auVar15._16_4_ = fVar87 * 0.0;
  auVar15._20_4_ = fVar162 * 0.0;
  auVar15._24_4_ = fVar87 * 0.0;
  auVar15._28_4_ = fVar266;
  auVar124 = vfmadd231ps_fma(auVar15,auVar80,auVar106);
  auVar7 = vshufps_avx(auVar90,auVar90,0xaa);
  local_720._8_8_ = auVar7._0_8_;
  local_720._0_8_ = local_720._8_8_;
  local_720._16_8_ = local_720._8_8_;
  local_720._24_8_ = local_720._8_8_;
  auVar8 = vshufps_avx(auVar90,auVar90,0xff);
  uStack_798 = auVar8._0_8_;
  local_7a0 = (undefined1  [8])uStack_798;
  uStack_790 = uStack_798;
  uStack_788 = uStack_798;
  auVar16._4_4_ = fVar60 * fVar86;
  auVar16._0_4_ = fVar60 * fVar84;
  auVar16._8_4_ = fVar60 * fVar120;
  auVar16._12_4_ = fVar60 * fVar85;
  auVar16._16_4_ = fVar60 * 0.0;
  auVar16._20_4_ = fVar60 * 0.0;
  auVar16._24_4_ = fVar60 * 0.0;
  auVar16._28_4_ = fVar60;
  auVar90 = vfmadd231ps_fma(auVar16,auVar80,auVar190);
  auVar8 = vshufps_avx(auVar247,auVar247,0xaa);
  auVar191._0_8_ = auVar8._0_8_;
  auVar191._8_8_ = auVar191._0_8_;
  auVar191._16_8_ = auVar191._0_8_;
  auVar191._24_8_ = auVar191._0_8_;
  auVar127 = vshufps_avx(auVar247,auVar247,0xff);
  local_620._8_8_ = auVar127._0_8_;
  local_620._0_8_ = local_620._8_8_;
  local_620._16_8_ = local_620._8_8_;
  local_620._24_8_ = local_620._8_8_;
  fVar87 = auVar110._0_4_;
  fVar162 = auVar110._4_4_;
  auVar17._4_4_ = fVar162 * fVar86;
  auVar17._0_4_ = fVar87 * fVar84;
  auVar17._8_4_ = fVar87 * fVar120;
  auVar17._12_4_ = fVar162 * fVar85;
  auVar17._16_4_ = fVar87 * 0.0;
  auVar17._20_4_ = fVar162 * 0.0;
  auVar17._24_4_ = fVar87 * 0.0;
  auVar17._28_4_ = auVar7._4_4_;
  auVar225 = vfmadd231ps_fma(auVar17,auVar80,auVar205);
  auVar18._28_4_ = fVar162;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(auVar209._12_4_ * fVar85,
                          CONCAT48(auVar209._8_4_ * fVar120,
                                   CONCAT44(auVar209._4_4_ * fVar86,auVar209._0_4_ * fVar84))));
  auVar240 = vfmadd231ps_fma(auVar18,auVar80,ZEXT1632(auVar240));
  fVar87 = auVar127._4_4_;
  auVar255._28_4_ = fVar87;
  auVar255._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar85,
                          CONCAT48(auVar124._8_4_ * fVar120,
                                   CONCAT44(auVar124._4_4_ * fVar86,auVar124._0_4_ * fVar84))));
  auVar183 = vfmadd231ps_fma(auVar255,auVar80,ZEXT1632(auVar183));
  auVar7 = vshufps_avx(auVar145,auVar145,0xaa);
  uVar89 = auVar7._0_8_;
  auVar179._8_8_ = uVar89;
  auVar179._0_8_ = uVar89;
  auVar179._16_8_ = uVar89;
  auVar179._24_8_ = uVar89;
  auVar110 = vshufps_avx(auVar145,auVar145,0xff);
  uVar89 = auVar110._0_8_;
  auVar282._8_8_ = uVar89;
  auVar282._0_8_ = uVar89;
  auVar282._16_8_ = uVar89;
  auVar282._24_8_ = uVar89;
  auVar145 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar90._12_4_ * fVar85,
                                                CONCAT48(auVar90._8_4_ * fVar120,
                                                         CONCAT44(auVar90._4_4_ * fVar86,
                                                                  auVar90._0_4_ * fVar84)))),auVar80
                             ,ZEXT1632(auVar209));
  auVar90 = vshufps_avx(auVar163,auVar163,0xaa);
  auVar247 = vshufps_avx(auVar163,auVar163,0xff);
  auVar163 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar225._12_4_,
                                                CONCAT48(fVar120 * auVar225._8_4_,
                                                         CONCAT44(fVar86 * auVar225._4_4_,
                                                                  fVar84 * auVar225._0_4_)))),
                             auVar80,ZEXT1632(auVar124));
  auVar209 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar145._12_4_,
                                                CONCAT48(fVar120 * auVar145._8_4_,
                                                         CONCAT44(fVar86 * auVar145._4_4_,
                                                                  fVar84 * auVar145._0_4_)))),
                             auVar80,ZEXT1632(auVar240));
  auVar14 = vsubps_avx(ZEXT1632(auVar145),ZEXT1632(auVar240));
  auVar145 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar163._12_4_,
                                                CONCAT48(fVar120 * auVar163._8_4_,
                                                         CONCAT44(fVar86 * auVar163._4_4_,
                                                                  fVar84 * auVar163._0_4_)))),
                             auVar80,ZEXT1632(auVar183));
  auVar81 = vsubps_avx(ZEXT1632(auVar163),ZEXT1632(auVar183));
  fStack_5e4 = auVar81._28_4_;
  auVar254._0_4_ = fStack_288 * auVar14._0_4_ * 3.0;
  auVar254._4_4_ = fStack_288 * auVar14._4_4_ * 3.0;
  auVar254._8_4_ = fStack_288 * auVar14._8_4_ * 3.0;
  auVar254._12_4_ = fStack_288 * auVar14._12_4_ * 3.0;
  auVar254._16_4_ = fStack_288 * auVar14._16_4_ * 3.0;
  auVar254._20_4_ = fStack_288 * auVar14._20_4_ * 3.0;
  auVar254._24_4_ = fStack_288 * auVar14._24_4_ * 3.0;
  auVar254._28_4_ = 0;
  local_600._0_4_ = fStack_288 * auVar81._0_4_ * 3.0;
  local_600._4_4_ = fStack_288 * auVar81._4_4_ * 3.0;
  fStack_5f8 = fStack_288 * auVar81._8_4_ * 3.0;
  fStack_5f4 = fStack_288 * auVar81._12_4_ * 3.0;
  fStack_5f0 = fStack_288 * auVar81._16_4_ * 3.0;
  fStack_5ec = fStack_288 * auVar81._20_4_ * 3.0;
  fStack_5e8 = fStack_288 * auVar81._24_4_ * 3.0;
  fVar162 = auVar8._0_4_;
  fVar60 = auVar8._4_4_;
  auVar21._4_4_ = fVar60 * fVar86;
  auVar21._0_4_ = fVar162 * fVar84;
  auVar21._8_4_ = fVar162 * fVar120;
  auVar21._12_4_ = fVar60 * fVar85;
  auVar21._16_4_ = fVar162 * 0.0;
  auVar21._20_4_ = fVar60 * 0.0;
  auVar21._24_4_ = fVar162 * 0.0;
  auVar21._28_4_ = fStack_5e4;
  auVar8 = vfmadd231ps_fma(auVar21,auVar80,local_720);
  fVar162 = auVar127._0_4_;
  auVar22._4_4_ = fVar87 * fVar86;
  auVar22._0_4_ = fVar162 * fVar84;
  auVar22._8_4_ = fVar162 * fVar120;
  auVar22._12_4_ = fVar87 * fVar85;
  auVar22._16_4_ = fVar162 * 0.0;
  auVar22._20_4_ = fVar87 * 0.0;
  auVar22._24_4_ = fVar162 * 0.0;
  auVar22._28_4_ = 0;
  auVar127 = vfmadd231ps_fma(auVar22,auVar80,_local_7a0);
  fVar87 = auVar7._0_4_;
  fVar162 = auVar7._4_4_;
  auVar23._4_4_ = fVar162 * fVar86;
  auVar23._0_4_ = fVar87 * fVar84;
  auVar23._8_4_ = fVar87 * fVar120;
  auVar23._12_4_ = fVar162 * fVar85;
  auVar23._16_4_ = fVar87 * 0.0;
  auVar23._20_4_ = fVar162 * 0.0;
  auVar23._24_4_ = fVar87 * 0.0;
  auVar23._28_4_ = auVar14._28_4_;
  auVar7 = vfmadd231ps_fma(auVar23,auVar80,auVar191);
  fVar87 = auVar110._0_4_;
  fVar224 = auVar110._4_4_;
  auVar24._4_4_ = fVar224 * fVar86;
  auVar24._0_4_ = fVar87 * fVar84;
  auVar24._8_4_ = fVar87 * fVar120;
  auVar24._12_4_ = fVar224 * fVar85;
  auVar24._16_4_ = fVar87 * 0.0;
  auVar24._20_4_ = fVar224 * 0.0;
  auVar24._24_4_ = fVar87 * 0.0;
  auVar24._28_4_ = fVar60;
  auVar110 = vfmadd231ps_fma(auVar24,auVar80,local_620);
  auVar15 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar209));
  fVar87 = auVar90._0_4_;
  fVar162 = auVar90._4_4_;
  auVar25._4_4_ = fVar162 * fVar86;
  auVar25._0_4_ = fVar87 * fVar84;
  auVar25._8_4_ = fVar87 * fVar120;
  auVar25._12_4_ = fVar162 * fVar85;
  auVar25._16_4_ = fVar87 * 0.0;
  auVar25._20_4_ = fVar162 * 0.0;
  auVar25._24_4_ = fVar87 * 0.0;
  auVar25._28_4_ = fVar162;
  auVar90 = vfmadd231ps_fma(auVar25,auVar80,auVar179);
  auVar16 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar145));
  fVar87 = auVar247._0_4_;
  fVar162 = auVar247._4_4_;
  auVar26._4_4_ = fVar162 * fVar86;
  auVar26._0_4_ = fVar87 * fVar84;
  auVar26._8_4_ = fVar87 * fVar120;
  auVar26._12_4_ = fVar162 * fVar85;
  auVar26._16_4_ = fVar87 * 0.0;
  auVar26._20_4_ = fVar162 * 0.0;
  auVar26._24_4_ = fVar87 * 0.0;
  auVar26._28_4_ = fVar162;
  auVar247 = vfmadd231ps_fma(auVar26,auVar80,auVar282);
  auVar27._28_4_ = fVar224;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar7._12_4_ * fVar85,
                          CONCAT48(auVar7._8_4_ * fVar120,
                                   CONCAT44(auVar7._4_4_ * fVar86,auVar7._0_4_ * fVar84))));
  auVar8 = vfmadd231ps_fma(auVar27,auVar80,ZEXT1632(auVar8));
  auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar110._12_4_,
                                                CONCAT48(fVar120 * auVar110._8_4_,
                                                         CONCAT44(fVar86 * auVar110._4_4_,
                                                                  fVar84 * auVar110._0_4_)))),
                             auVar80,ZEXT1632(auVar127));
  auVar107._0_4_ = auVar209._0_4_ + auVar254._0_4_;
  auVar107._4_4_ = auVar209._4_4_ + auVar254._4_4_;
  auVar107._8_4_ = auVar209._8_4_ + auVar254._8_4_;
  auVar107._12_4_ = auVar209._12_4_ + auVar254._12_4_;
  auVar107._16_4_ = auVar254._16_4_ + 0.0;
  auVar107._20_4_ = auVar254._20_4_ + 0.0;
  auVar107._24_4_ = auVar254._24_4_ + 0.0;
  auVar107._28_4_ = 0;
  auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar90._12_4_ * fVar85,
                                              CONCAT48(auVar90._8_4_ * fVar120,
                                                       CONCAT44(auVar90._4_4_ * fVar86,
                                                                auVar90._0_4_ * fVar84)))),auVar80,
                           ZEXT1632(auVar7));
  auVar110 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar247._12_4_ * fVar85,
                                                CONCAT48(auVar247._8_4_ * fVar120,
                                                         CONCAT44(auVar247._4_4_ * fVar86,
                                                                  auVar247._0_4_ * fVar84)))),
                             auVar80,ZEXT1632(auVar110));
  auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar7._12_4_,
                                               CONCAT48(fVar120 * auVar7._8_4_,
                                                        CONCAT44(fVar86 * auVar7._4_4_,
                                                                 fVar84 * auVar7._0_4_)))),auVar80,
                            ZEXT1632(auVar8));
  auVar247 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar110._12_4_ * fVar85,
                                                CONCAT48(auVar110._8_4_ * fVar120,
                                                         CONCAT44(auVar110._4_4_ * fVar86,
                                                                  auVar110._0_4_ * fVar84)))),
                             ZEXT1632(auVar127),auVar80);
  auVar80 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar14 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar127));
  auVar276._0_4_ = fStack_288 * auVar80._0_4_ * 3.0;
  auVar276._4_4_ = fStack_288 * auVar80._4_4_ * 3.0;
  auVar276._8_4_ = fStack_288 * auVar80._8_4_ * 3.0;
  auVar276._12_4_ = fStack_288 * auVar80._12_4_ * 3.0;
  auVar276._16_4_ = fStack_288 * auVar80._16_4_ * 3.0;
  auVar276._20_4_ = fStack_288 * auVar80._20_4_ * 3.0;
  auVar276._24_4_ = fStack_288 * auVar80._24_4_ * 3.0;
  auVar276._28_4_ = 0;
  local_2a0 = fStack_288 * auVar14._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar14._4_4_ * 3.0;
  auVar28._4_4_ = fStack_29c;
  auVar28._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar14._8_4_ * 3.0;
  auVar28._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar14._12_4_ * 3.0;
  auVar28._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar14._16_4_ * 3.0;
  auVar28._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar14._20_4_ * 3.0;
  auVar28._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar14._24_4_ * 3.0;
  auVar28._24_4_ = fStack_288;
  auVar28._28_4_ = 0x40400000;
  auVar17 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar90));
  local_4e0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar247));
  auVar80 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar209));
  auVar14 = vsubps_avx(ZEXT1632(auVar247),ZEXT1632(auVar145));
  auVar81 = vsubps_avx(auVar17,auVar15);
  fVar266 = auVar80._0_4_ + auVar81._0_4_;
  fVar267 = auVar80._4_4_ + auVar81._4_4_;
  fVar268 = auVar80._8_4_ + auVar81._8_4_;
  fVar193 = auVar80._12_4_ + auVar81._12_4_;
  fVar194 = auVar80._16_4_ + auVar81._16_4_;
  fVar195 = auVar80._20_4_ + auVar81._20_4_;
  fVar196 = auVar80._24_4_ + auVar81._24_4_;
  auVar13 = vsubps_avx(local_4e0,auVar16);
  auVar82._0_4_ = auVar14._0_4_ + auVar13._0_4_;
  auVar82._4_4_ = auVar14._4_4_ + auVar13._4_4_;
  auVar82._8_4_ = auVar14._8_4_ + auVar13._8_4_;
  auVar82._12_4_ = auVar14._12_4_ + auVar13._12_4_;
  auVar82._16_4_ = auVar14._16_4_ + auVar13._16_4_;
  auVar82._20_4_ = auVar14._20_4_ + auVar13._20_4_;
  auVar82._24_4_ = auVar14._24_4_ + auVar13._24_4_;
  auVar82._28_4_ = auVar14._28_4_ + auVar13._28_4_;
  local_240 = ZEXT1632(auVar145);
  fVar84 = auVar145._0_4_;
  local_2c0 = (float)local_600._0_4_ + fVar84;
  fVar86 = auVar145._4_4_;
  fStack_2bc = (float)local_600._4_4_ + fVar86;
  fVar120 = auVar145._8_4_;
  fStack_2b8 = fStack_5f8 + fVar120;
  fVar85 = auVar145._12_4_;
  fStack_2b4 = fStack_5f4 + fVar85;
  fStack_2b0 = fStack_5f0 + 0.0;
  fStack_2ac = fStack_5ec + 0.0;
  fStack_2a8 = fStack_5e8 + 0.0;
  local_200 = ZEXT1632(auVar209);
  auVar14 = vsubps_avx(local_200,auVar254);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar14);
  auVar14 = vsubps_avx(local_240,_local_600);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar14);
  local_260._0_4_ = auVar90._0_4_ + auVar276._0_4_;
  local_260._4_4_ = auVar90._4_4_ + auVar276._4_4_;
  local_260._8_4_ = auVar90._8_4_ + auVar276._8_4_;
  local_260._12_4_ = auVar90._12_4_ + auVar276._12_4_;
  local_260._16_4_ = auVar276._16_4_ + 0.0;
  local_260._20_4_ = auVar276._20_4_ + 0.0;
  local_260._24_4_ = auVar276._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar255 = ZEXT1632(auVar90);
  auVar14 = vsubps_avx(auVar255,auVar276);
  auVar18 = vpermps_avx2(_DAT_01fb7720,auVar14);
  fVar87 = auVar247._0_4_;
  local_2a0 = fVar87 + local_2a0;
  fVar162 = auVar247._4_4_;
  fStack_29c = fVar162 + fStack_29c;
  fVar60 = auVar247._8_4_;
  fStack_298 = fVar60 + fStack_298;
  fVar224 = auVar247._12_4_;
  fStack_294 = fVar224 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar14 = vsubps_avx(ZEXT1632(auVar247),auVar28);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar14);
  auVar29._4_4_ = fVar86 * fVar267;
  auVar29._0_4_ = fVar84 * fVar266;
  auVar29._8_4_ = fVar120 * fVar268;
  auVar29._12_4_ = fVar85 * fVar193;
  auVar29._16_4_ = fVar194 * 0.0;
  auVar29._20_4_ = fVar195 * 0.0;
  auVar29._24_4_ = fVar196 * 0.0;
  auVar29._28_4_ = auVar14._28_4_;
  auVar7 = vfnmadd231ps_fma(auVar29,local_200,auVar82);
  fStack_2a4 = fStack_5e4 + 0.0;
  auVar30._4_4_ = fStack_2bc * fVar267;
  auVar30._0_4_ = local_2c0 * fVar266;
  auVar30._8_4_ = fStack_2b8 * fVar268;
  auVar30._12_4_ = fStack_2b4 * fVar193;
  auVar30._16_4_ = fStack_2b0 * fVar194;
  auVar30._20_4_ = fStack_2ac * fVar195;
  auVar30._24_4_ = fStack_2a8 * fVar196;
  auVar30._28_4_ = 0;
  auVar8 = vfnmadd231ps_fma(auVar30,auVar82,auVar107);
  auVar31._4_4_ = local_2e0._4_4_ * fVar267;
  auVar31._0_4_ = local_2e0._0_4_ * fVar266;
  auVar31._8_4_ = local_2e0._8_4_ * fVar268;
  auVar31._12_4_ = local_2e0._12_4_ * fVar193;
  auVar31._16_4_ = local_2e0._16_4_ * fVar194;
  auVar31._20_4_ = local_2e0._20_4_ * fVar195;
  auVar31._24_4_ = local_2e0._24_4_ * fVar196;
  auVar31._28_4_ = fStack_5e4 + 0.0;
  auVar127 = vfnmadd231ps_fma(auVar31,local_220,auVar82);
  local_7a0._0_4_ = auVar16._0_4_;
  local_7a0._4_4_ = auVar16._4_4_;
  uStack_798._0_4_ = auVar16._8_4_;
  uStack_798._4_4_ = auVar16._12_4_;
  uStack_790._0_4_ = auVar16._16_4_;
  uStack_790._4_4_ = auVar16._20_4_;
  uStack_788._0_4_ = auVar16._24_4_;
  uStack_788._4_4_ = auVar16._28_4_;
  auVar32._4_4_ = (float)local_7a0._4_4_ * fVar267;
  auVar32._0_4_ = (float)local_7a0._0_4_ * fVar266;
  auVar32._8_4_ = (float)uStack_798 * fVar268;
  auVar32._12_4_ = uStack_798._4_4_ * fVar193;
  auVar32._16_4_ = (float)uStack_790 * fVar194;
  auVar32._20_4_ = uStack_790._4_4_ * fVar195;
  auVar32._24_4_ = (float)uStack_788 * fVar196;
  auVar32._28_4_ = uStack_788._4_4_;
  auVar110 = vfnmadd231ps_fma(auVar32,auVar15,auVar82);
  auVar206._0_4_ = fVar87 * fVar266;
  auVar206._4_4_ = fVar162 * fVar267;
  auVar206._8_4_ = fVar60 * fVar268;
  auVar206._12_4_ = fVar224 * fVar193;
  auVar206._16_4_ = fVar194 * 0.0;
  auVar206._20_4_ = fVar195 * 0.0;
  auVar206._24_4_ = fVar196 * 0.0;
  auVar206._28_4_ = 0;
  auVar90 = vfnmadd231ps_fma(auVar206,auVar255,auVar82);
  uStack_284 = 0x40400000;
  auVar33._4_4_ = fStack_29c * fVar267;
  auVar33._0_4_ = local_2a0 * fVar266;
  auVar33._8_4_ = fStack_298 * fVar268;
  auVar33._12_4_ = fStack_294 * fVar193;
  auVar33._16_4_ = fStack_290 * fVar194;
  auVar33._20_4_ = fStack_28c * fVar195;
  auVar33._24_4_ = fStack_288 * fVar196;
  auVar33._28_4_ = auVar15._28_4_;
  auVar145 = vfnmadd231ps_fma(auVar33,local_260,auVar82);
  auVar34._4_4_ = local_280._4_4_ * fVar267;
  auVar34._0_4_ = local_280._0_4_ * fVar266;
  auVar34._8_4_ = local_280._8_4_ * fVar268;
  auVar34._12_4_ = local_280._12_4_ * fVar193;
  auVar34._16_4_ = local_280._16_4_ * fVar194;
  auVar34._20_4_ = local_280._20_4_ * fVar195;
  auVar34._24_4_ = local_280._24_4_ * fVar196;
  auVar34._28_4_ = local_280._28_4_;
  auVar163 = vfnmadd231ps_fma(auVar34,auVar18,auVar82);
  auVar35._4_4_ = local_4e0._4_4_ * fVar267;
  auVar35._0_4_ = local_4e0._0_4_ * fVar266;
  auVar35._8_4_ = local_4e0._8_4_ * fVar268;
  auVar35._12_4_ = local_4e0._12_4_ * fVar193;
  auVar35._16_4_ = local_4e0._16_4_ * fVar194;
  auVar35._20_4_ = local_4e0._20_4_ * fVar195;
  auVar35._24_4_ = local_4e0._24_4_ * fVar196;
  auVar35._28_4_ = auVar80._28_4_ + auVar81._28_4_;
  auVar222 = ZEXT3264(auVar17);
  auVar240 = vfnmadd231ps_fma(auVar35,auVar17,auVar82);
  auVar14 = vminps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar80 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar81 = vminps_avx(ZEXT1632(auVar127),ZEXT1632(auVar110));
  auVar81 = vminps_avx(auVar14,auVar81);
  auVar14 = vmaxps_avx(ZEXT1632(auVar127),ZEXT1632(auVar110));
  auVar80 = vmaxps_avx(auVar80,auVar14);
  auVar13 = vminps_avx(ZEXT1632(auVar90),ZEXT1632(auVar145));
  auVar14 = vmaxps_avx(ZEXT1632(auVar90),ZEXT1632(auVar145));
  auVar9 = vminps_avx(ZEXT1632(auVar163),ZEXT1632(auVar240));
  auVar13 = vminps_avx(auVar13,auVar9);
  auVar13 = vminps_avx(auVar81,auVar13);
  auVar81 = vmaxps_avx(ZEXT1632(auVar163),ZEXT1632(auVar240));
  auVar14 = vmaxps_avx(auVar14,auVar81);
  auVar14 = vmaxps_avx(auVar80,auVar14);
  auVar44._4_4_ = fStack_1bc;
  auVar44._0_4_ = local_1c0;
  auVar44._8_4_ = fStack_1b8;
  auVar44._12_4_ = fStack_1b4;
  auVar44._16_4_ = fStack_1b0;
  auVar44._20_4_ = fStack_1ac;
  auVar44._24_4_ = fStack_1a8;
  auVar44._28_4_ = fStack_1a4;
  auVar80 = vcmpps_avx(auVar13,auVar44,2);
  auVar43._4_4_ = fStack_1dc;
  auVar43._0_4_ = local_1e0;
  auVar43._8_4_ = fStack_1d8;
  auVar43._12_4_ = fStack_1d4;
  auVar43._16_4_ = fStack_1d0;
  auVar43._20_4_ = fStack_1cc;
  auVar43._24_4_ = fStack_1c8;
  auVar43._28_4_ = fStack_1c4;
  auVar14 = vcmpps_avx(auVar14,auVar43,5);
  auVar80 = vandps_avx(auVar14,auVar80);
  auVar14 = local_300 & auVar80;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vsubps_avx(auVar15,local_200);
    auVar81 = vsubps_avx(auVar17,auVar255);
    fVar267 = auVar14._0_4_ + auVar81._0_4_;
    fVar268 = auVar14._4_4_ + auVar81._4_4_;
    fVar193 = auVar14._8_4_ + auVar81._8_4_;
    fVar194 = auVar14._12_4_ + auVar81._12_4_;
    fVar195 = auVar14._16_4_ + auVar81._16_4_;
    fVar196 = auVar14._20_4_ + auVar81._20_4_;
    fVar88 = auVar14._24_4_ + auVar81._24_4_;
    auVar13 = vsubps_avx(auVar16,local_240);
    auVar9 = vsubps_avx(local_4e0,ZEXT1632(auVar247));
    auVar108._0_4_ = auVar13._0_4_ + auVar9._0_4_;
    auVar108._4_4_ = auVar13._4_4_ + auVar9._4_4_;
    auVar108._8_4_ = auVar13._8_4_ + auVar9._8_4_;
    auVar108._12_4_ = auVar13._12_4_ + auVar9._12_4_;
    auVar108._16_4_ = auVar13._16_4_ + auVar9._16_4_;
    auVar108._20_4_ = auVar13._20_4_ + auVar9._20_4_;
    auVar108._24_4_ = auVar13._24_4_ + auVar9._24_4_;
    fVar266 = auVar9._28_4_;
    auVar108._28_4_ = auVar13._28_4_ + fVar266;
    auVar36._4_4_ = fVar86 * fVar268;
    auVar36._0_4_ = fVar84 * fVar267;
    auVar36._8_4_ = fVar120 * fVar193;
    auVar36._12_4_ = fVar85 * fVar194;
    auVar36._16_4_ = fVar195 * 0.0;
    auVar36._20_4_ = fVar196 * 0.0;
    auVar36._24_4_ = fVar88 * 0.0;
    auVar36._28_4_ = local_4e0._28_4_;
    auVar90 = vfnmadd231ps_fma(auVar36,auVar108,local_200);
    auVar37._4_4_ = fVar268 * fStack_2bc;
    auVar37._0_4_ = fVar267 * local_2c0;
    auVar37._8_4_ = fVar193 * fStack_2b8;
    auVar37._12_4_ = fVar194 * fStack_2b4;
    auVar37._16_4_ = fVar195 * fStack_2b0;
    auVar37._20_4_ = fVar196 * fStack_2ac;
    auVar37._24_4_ = fVar88 * fStack_2a8;
    auVar37._28_4_ = 0;
    auVar7 = vfnmadd213ps_fma(auVar107,auVar108,auVar37);
    auVar38._4_4_ = fVar268 * local_2e0._4_4_;
    auVar38._0_4_ = fVar267 * local_2e0._0_4_;
    auVar38._8_4_ = fVar193 * local_2e0._8_4_;
    auVar38._12_4_ = fVar194 * local_2e0._12_4_;
    auVar38._16_4_ = fVar195 * local_2e0._16_4_;
    auVar38._20_4_ = fVar196 * local_2e0._20_4_;
    auVar38._24_4_ = fVar88 * local_2e0._24_4_;
    auVar38._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(local_220,auVar108,auVar38);
    auVar39._4_4_ = (float)local_7a0._4_4_ * fVar268;
    auVar39._0_4_ = (float)local_7a0._0_4_ * fVar267;
    auVar39._8_4_ = (float)uStack_798 * fVar193;
    auVar39._12_4_ = uStack_798._4_4_ * fVar194;
    auVar39._16_4_ = (float)uStack_790 * fVar195;
    auVar39._20_4_ = uStack_790._4_4_ * fVar196;
    auVar39._24_4_ = (float)uStack_788 * fVar88;
    auVar39._28_4_ = 0;
    auVar247 = vfnmadd231ps_fma(auVar39,auVar108,auVar15);
    auVar132._0_4_ = fVar87 * fVar267;
    auVar132._4_4_ = fVar162 * fVar268;
    auVar132._8_4_ = fVar60 * fVar193;
    auVar132._12_4_ = fVar224 * fVar194;
    auVar132._16_4_ = fVar195 * 0.0;
    auVar132._20_4_ = fVar196 * 0.0;
    auVar132._24_4_ = fVar88 * 0.0;
    auVar132._28_4_ = 0;
    auVar145 = vfnmadd231ps_fma(auVar132,auVar108,auVar255);
    auVar40._4_4_ = fVar268 * fStack_29c;
    auVar40._0_4_ = fVar267 * local_2a0;
    auVar40._8_4_ = fVar193 * fStack_298;
    auVar40._12_4_ = fVar194 * fStack_294;
    auVar40._16_4_ = fVar195 * fStack_290;
    auVar40._20_4_ = fVar196 * fStack_28c;
    auVar40._24_4_ = fVar88 * fStack_288;
    auVar40._28_4_ = fVar266;
    auVar127 = vfnmadd213ps_fma(local_260,auVar108,auVar40);
    auVar41._4_4_ = fVar268 * local_280._4_4_;
    auVar41._0_4_ = fVar267 * local_280._0_4_;
    auVar41._8_4_ = fVar193 * local_280._8_4_;
    auVar41._12_4_ = fVar194 * local_280._12_4_;
    auVar41._16_4_ = fVar195 * local_280._16_4_;
    auVar41._20_4_ = fVar196 * local_280._20_4_;
    auVar41._24_4_ = fVar88 * local_280._24_4_;
    auVar41._28_4_ = fVar266;
    auVar110 = vfnmadd213ps_fma(auVar18,auVar108,auVar41);
    auVar222 = ZEXT1664(auVar110);
    auVar42._4_4_ = fVar268 * local_4e0._4_4_;
    auVar42._0_4_ = fVar267 * local_4e0._0_4_;
    auVar42._8_4_ = fVar193 * local_4e0._8_4_;
    auVar42._12_4_ = fVar194 * local_4e0._12_4_;
    auVar42._16_4_ = fVar195 * local_4e0._16_4_;
    auVar42._20_4_ = fVar196 * local_4e0._20_4_;
    auVar42._24_4_ = fVar88 * local_4e0._24_4_;
    auVar42._28_4_ = auVar14._28_4_ + auVar81._28_4_;
    auVar163 = vfnmadd231ps_fma(auVar42,auVar108,auVar17);
    auVar81 = vminps_avx(ZEXT1632(auVar90),ZEXT1632(auVar7));
    auVar14 = vmaxps_avx(ZEXT1632(auVar90),ZEXT1632(auVar7));
    auVar13 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar247));
    auVar13 = vminps_avx(auVar81,auVar13);
    auVar81 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar247));
    auVar14 = vmaxps_avx(auVar14,auVar81);
    auVar9 = vminps_avx(ZEXT1632(auVar145),ZEXT1632(auVar127));
    auVar81 = vmaxps_avx(ZEXT1632(auVar145),ZEXT1632(auVar127));
    auVar15 = vminps_avx(ZEXT1632(auVar110),ZEXT1632(auVar163));
    auVar9 = vminps_avx(auVar9,auVar15);
    auVar9 = vminps_avx(auVar13,auVar9);
    auVar13 = vmaxps_avx(ZEXT1632(auVar110),ZEXT1632(auVar163));
    auVar81 = vmaxps_avx(auVar81,auVar13);
    auVar81 = vmaxps_avx(auVar14,auVar81);
    auVar14 = vcmpps_avx(auVar9,auVar44,2);
    auVar81 = vcmpps_avx(auVar81,auVar43,5);
    auVar14 = vandps_avx(auVar81,auVar14);
    auVar80 = vandps_avx(auVar80,local_300);
    auVar81 = auVar80 & auVar14;
    if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar81 >> 0x7f,0) != '\0') ||
          (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar81 >> 0xbf,0) != '\0') ||
        (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar81[0x1f] < '\0')
    {
      auVar80 = vandps_avx(auVar14,auVar80);
      uVar54 = vmovmskps_avx(auVar80);
      if (uVar54 != 0) {
        auStack_520[uVar53] = uVar54 & 0xff;
        uVar89 = vmovlps_avx(local_440);
        *(undefined8 *)(&uStack_380 + uVar53 * 2) = uVar89;
        uVar55 = vmovlps_avx(auVar67);
        auStack_1a0[uVar53] = uVar55;
        uVar53 = (ulong)((int)uVar53 + 1);
      }
    }
  }
LAB_0110ecf2:
  if ((int)uVar53 != 0) {
    uVar46 = (int)uVar53 - 1;
    uVar49 = (ulong)uVar46;
    uVar52 = auStack_520[uVar49];
    uVar54 = (&uStack_380)[uVar49 * 2];
    fVar84 = afStack_37c[uVar49 * 2];
    iVar45 = 0;
    for (uVar55 = (ulong)uVar52; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      iVar45 = iVar45 + 1;
    }
    uVar52 = uVar52 - 1 & uVar52;
    if (uVar52 == 0) {
      uVar53 = (ulong)uVar46;
    }
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auStack_1a0[uVar49];
    auStack_520[uVar49] = uVar52;
    fVar86 = (float)(iVar45 + 1) * 0.14285715;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * (float)iVar45 * 0.14285715)),ZEXT416(uVar54),
                             ZEXT416((uint)(1.0 - (float)iVar45 * 0.14285715)));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * fVar86)),ZEXT416(uVar54),
                             ZEXT416((uint)(1.0 - fVar86)));
    fVar86 = auVar8._0_4_;
    auVar192._0_4_ = auVar7._0_4_;
    fVar84 = fVar86 - auVar192._0_4_;
    if (fVar84 < 0.16666667) {
      auVar127 = vshufps_avx(auVar67,auVar67,0x50);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar110 = vsubps_avx(auVar96,auVar127);
      fVar120 = auVar127._0_4_;
      auVar138._0_4_ = fVar120 * fVar134;
      fVar85 = auVar127._4_4_;
      auVar138._4_4_ = fVar85 * fVar143;
      fVar87 = auVar127._8_4_;
      auVar138._8_4_ = fVar87 * fVar134;
      fVar162 = auVar127._12_4_;
      auVar138._12_4_ = fVar162 * fVar143;
      auVar151._0_4_ = fVar120 * fVar144;
      auVar151._4_4_ = fVar85 * fVar256;
      auVar151._8_4_ = fVar87 * fVar144;
      auVar151._12_4_ = fVar162 * fVar256;
      auVar176._0_4_ = fVar120 * fVar197;
      auVar176._4_4_ = fVar85 * fVar207;
      auVar176._8_4_ = fVar87 * fVar197;
      auVar176._12_4_ = fVar162 * fVar207;
      auVar69._0_4_ = fVar120 * fVar208;
      auVar69._4_4_ = fVar85 * fVar223;
      auVar69._8_4_ = fVar87 * fVar208;
      auVar69._12_4_ = fVar162 * fVar223;
      auVar127 = vfmadd231ps_fma(auVar138,auVar110,auVar186);
      auVar90 = vfmadd231ps_fma(auVar151,auVar110,auVar229);
      auVar247 = vfmadd231ps_fma(auVar176,auVar110,auVar246);
      auVar110 = vfmadd231ps_fma(auVar69,auVar110,auVar259);
      auVar133._16_16_ = auVar127;
      auVar133._0_16_ = auVar127;
      auVar142._16_16_ = auVar90;
      auVar142._0_16_ = auVar90;
      auVar160._16_16_ = auVar247;
      auVar160._0_16_ = auVar247;
      auVar192._4_4_ = auVar192._0_4_;
      auVar192._8_4_ = auVar192._0_4_;
      auVar192._12_4_ = auVar192._0_4_;
      auVar192._20_4_ = fVar86;
      auVar192._16_4_ = fVar86;
      auVar192._24_4_ = fVar86;
      auVar192._28_4_ = fVar86;
      auVar80 = vsubps_avx(auVar142,auVar133);
      auVar90 = vfmadd213ps_fma(auVar80,auVar192,auVar133);
      auVar80 = vsubps_avx(auVar160,auVar142);
      auVar145 = vfmadd213ps_fma(auVar80,auVar192,auVar142);
      auVar127 = vsubps_avx(auVar110,auVar247);
      auVar83._16_16_ = auVar127;
      auVar83._0_16_ = auVar127;
      auVar127 = vfmadd213ps_fma(auVar83,auVar192,auVar160);
      auVar80 = vsubps_avx(ZEXT1632(auVar145),ZEXT1632(auVar90));
      auVar110 = vfmadd213ps_fma(auVar80,auVar192,ZEXT1632(auVar90));
      auVar80 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar145));
      auVar127 = vfmadd213ps_fma(auVar80,auVar192,ZEXT1632(auVar145));
      auVar80 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar110));
      auVar183 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar80,auVar192);
      fVar224 = auVar80._4_4_ * 3.0;
      fVar120 = fVar84 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar183._4_4_ + fVar120 * fVar224,
                    auVar183._0_4_ + fVar120 * auVar80._0_4_ * 3.0);
      local_4e0._8_4_ = auVar183._8_4_ + fVar120 * auVar80._8_4_ * 3.0;
      local_4e0._12_4_ = auVar183._12_4_ + fVar120 * auVar80._12_4_ * 3.0;
      auVar110 = vshufpd_avx(auVar183,auVar183,3);
      auVar90 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar127 = vsubps_avx(auVar110,auVar183);
      auVar247 = vsubps_avx(auVar90,(undefined1  [16])0x0);
      auVar70._0_4_ = auVar127._0_4_ + auVar247._0_4_;
      auVar70._4_4_ = auVar127._4_4_ + auVar247._4_4_;
      auVar70._8_4_ = auVar127._8_4_ + auVar247._8_4_;
      auVar70._12_4_ = auVar127._12_4_ + auVar247._12_4_;
      auVar127 = vshufps_avx(auVar183,auVar183,0xb1);
      auVar247 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar272._4_4_ = auVar70._0_4_;
      auVar272._0_4_ = auVar70._0_4_;
      auVar272._8_4_ = auVar70._0_4_;
      auVar272._12_4_ = auVar70._0_4_;
      auVar145 = vshufps_avx(auVar70,auVar70,0x55);
      fVar85 = auVar145._0_4_;
      auVar71._0_4_ = fVar85 * auVar127._0_4_;
      fVar87 = auVar145._4_4_;
      auVar71._4_4_ = fVar87 * auVar127._4_4_;
      fVar162 = auVar145._8_4_;
      auVar71._8_4_ = fVar162 * auVar127._8_4_;
      fVar60 = auVar145._12_4_;
      auVar71._12_4_ = fVar60 * auVar127._12_4_;
      auVar152._0_4_ = fVar85 * auVar247._0_4_;
      auVar152._4_4_ = fVar87 * auVar247._4_4_;
      auVar152._8_4_ = fVar162 * auVar247._8_4_;
      auVar152._12_4_ = fVar60 * auVar247._12_4_;
      auVar163 = vfmadd231ps_fma(auVar71,auVar272,auVar183);
      auVar240 = vfmadd231ps_fma(auVar152,auVar272,local_4e0._0_16_);
      auVar247 = vshufps_avx(auVar163,auVar163,0xe8);
      auVar145 = vshufps_avx(auVar240,auVar240,0xe8);
      auVar127 = vcmpps_avx(auVar247,auVar145,1);
      uVar54 = vextractps_avx(auVar127,0);
      auVar209 = auVar240;
      if ((uVar54 & 1) == 0) {
        auVar209 = auVar163;
      }
      auVar123._0_4_ = fVar120 * auVar80._16_4_ * 3.0;
      auVar123._4_4_ = fVar120 * fVar224;
      auVar123._8_4_ = fVar120 * auVar80._24_4_ * 3.0;
      auVar123._12_4_ = fVar120 * auVar222._28_4_;
      auVar270 = vsubps_avx((undefined1  [16])0x0,auVar123);
      auVar124 = vshufps_avx(auVar270,auVar270,0xb1);
      auVar225 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar187._0_4_ = fVar85 * auVar124._0_4_;
      auVar187._4_4_ = fVar87 * auVar124._4_4_;
      auVar187._8_4_ = fVar162 * auVar124._8_4_;
      auVar187._12_4_ = fVar60 * auVar124._12_4_;
      auVar200._0_4_ = auVar225._0_4_ * fVar85;
      auVar200._4_4_ = auVar225._4_4_ * fVar87;
      auVar200._8_4_ = auVar225._8_4_ * fVar162;
      auVar200._12_4_ = auVar225._12_4_ * fVar60;
      auVar19 = vfmadd231ps_fma(auVar187,auVar272,auVar270);
      auVar20 = vfmadd231ps_fma(auVar200,(undefined1  [16])0x0,auVar272);
      auVar225 = vshufps_avx(auVar19,auVar19,0xe8);
      auVar269 = vshufps_avx(auVar20,auVar20,0xe8);
      auVar222 = ZEXT1664(auVar269);
      auVar124 = vcmpps_avx(auVar225,auVar269,1);
      uVar54 = vextractps_avx(auVar124,0);
      auVar66 = auVar20;
      if ((uVar54 & 1) == 0) {
        auVar66 = auVar19;
      }
      auVar209 = vmaxss_avx(auVar66,auVar209);
      auVar247 = vminps_avx(auVar247,auVar145);
      auVar145 = vminps_avx(auVar225,auVar269);
      auVar145 = vminps_avx(auVar247,auVar145);
      auVar127 = vshufps_avx(auVar127,auVar127,0x55);
      auVar127 = vblendps_avx(auVar127,auVar124,2);
      auVar124 = vpslld_avx(auVar127,0x1f);
      auVar127 = vshufpd_avx(auVar240,auVar240,1);
      auVar127 = vinsertps_avx(auVar127,auVar20,0x9c);
      auVar247 = vshufpd_avx(auVar163,auVar163,1);
      auVar247 = vinsertps_avx(auVar247,auVar19,0x9c);
      auVar127 = vblendvps_avx(auVar247,auVar127,auVar124);
      auVar247 = vmovshdup_avx(auVar127);
      auVar127 = vmaxss_avx(auVar247,auVar127);
      fVar162 = auVar145._0_4_;
      auVar247 = vmovshdup_avx(auVar145);
      fVar87 = auVar127._0_4_;
      fVar120 = auVar247._0_4_;
      fVar85 = auVar209._0_4_;
      if (((0.0001 <= fVar162) || (fVar87 <= -0.0001)) && (0.0001 <= fVar120 || fVar87 <= -0.0001))
      goto code_r0x0110effe;
      goto LAB_0110f025;
    }
    local_440 = vinsertps_avx(auVar7,auVar8,0x10);
    goto LAB_0110e748;
  }
  if (bVar57) goto LAB_0110fbc7;
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar79._4_4_ = uVar56;
  auVar79._0_4_ = uVar56;
  auVar79._8_4_ = uVar56;
  auVar79._12_4_ = uVar56;
  auVar7 = vcmpps_avx(local_450,auVar79,2);
  uVar47 = vmovmskps_avx(auVar7);
  uVar48 = (ulong)((uint)uVar58 & uVar47);
  goto LAB_0110df7f;
code_r0x0110effe:
  auVar247 = vcmpps_avx(auVar247,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar163 = vcmpps_avx(auVar145,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar247 = vandps_avx(auVar163,auVar247);
  if (fVar85 <= -0.0001 || (auVar247 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0110ecf2;
LAB_0110f025:
  auVar163 = vcmpps_avx(auVar145,_DAT_01f45a50,1);
  auVar240 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar247 = vcmpss_avx(auVar209,ZEXT816(0) << 0x20,1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar114._8_4_ = 0xbf800000;
  auVar114._0_8_ = 0xbf800000bf800000;
  auVar114._12_4_ = 0xbf800000;
  auVar247 = vblendvps_avx(auVar97,auVar114,auVar247);
  auVar163 = vblendvps_avx(auVar97,auVar114,auVar163);
  fVar224 = auVar163._0_4_;
  fVar60 = auVar247._0_4_;
  auVar247 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar224 == fVar60) && (!NAN(fVar224) && !NAN(fVar60))) {
    auVar247 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar224 == fVar60) && (!NAN(fVar224) && !NAN(fVar60))) {
    auVar240 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar163 = vmovshdup_avx(auVar163);
  fVar266 = auVar163._0_4_;
  if ((fVar224 != fVar266) || (NAN(fVar224) || NAN(fVar266))) {
    if ((fVar120 != fVar162) || (NAN(fVar120) || NAN(fVar162))) {
      auVar125._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
      auVar125._8_4_ = auVar145._8_4_ ^ 0x80000000;
      auVar125._12_4_ = auVar145._12_4_ ^ 0x80000000;
      auVar126._0_4_ = -fVar162 / (fVar120 - fVar162);
      auVar126._4_12_ = auVar125._4_12_;
      auVar145 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
      auVar163 = auVar145;
    }
    else {
      auVar145 = ZEXT816(0) << 0x20;
      if ((fVar162 != 0.0) || (auVar163 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar162))) {
        auVar145 = SUB6416(ZEXT464(0x7f800000),0);
        auVar163 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar247 = vminss_avx(auVar247,auVar145);
    auVar240 = vmaxss_avx(auVar163,auVar240);
  }
  auVar127 = vcmpss_avx(auVar127,ZEXT416(0),1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar115._8_4_ = 0xbf800000;
  auVar115._0_8_ = 0xbf800000bf800000;
  auVar115._12_4_ = 0xbf800000;
  auVar127 = vblendvps_avx(auVar98,auVar115,auVar127);
  fVar120 = auVar127._0_4_;
  if ((fVar60 != fVar120) || (NAN(fVar60) || NAN(fVar120))) {
    if ((fVar87 != fVar85) || (NAN(fVar87) || NAN(fVar85))) {
      auVar72._0_8_ = auVar209._0_8_ ^ 0x8000000080000000;
      auVar72._8_4_ = auVar209._8_4_ ^ 0x80000000;
      auVar72._12_4_ = auVar209._12_4_ ^ 0x80000000;
      auVar128._0_4_ = -fVar85 / (fVar87 - fVar85);
      auVar128._4_12_ = auVar72._4_12_;
      auVar127 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar128,ZEXT416(0));
      auVar145 = auVar127;
    }
    else {
      auVar127 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar85 != 0.0) || (auVar145 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
        auVar127 = SUB6416(ZEXT464(0xff800000),0);
        auVar145 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar247 = vminss_avx(auVar247,auVar145);
    auVar240 = vmaxss_avx(auVar127,auVar240);
  }
  if ((fVar266 != fVar120) || (NAN(fVar266) || NAN(fVar120))) {
    auVar247 = vminss_avx(auVar247,SUB6416(ZEXT464(0x3f800000),0));
    auVar240 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar240);
  }
  auVar127 = vmaxss_avx(ZEXT816(0) << 0x40,auVar247);
  auVar247 = vminss_avx(auVar240,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar247._0_4_ < auVar127._0_4_) goto LAB_0110ecf2;
  auVar127 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar127._0_4_ + -0.1)));
  auVar247 = vminss_avx(ZEXT416((uint)(auVar247._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar139._0_8_ = auVar183._0_8_;
  auVar139._8_8_ = auVar139._0_8_;
  auVar214._8_8_ = local_4e0._0_8_;
  auVar214._0_8_ = local_4e0._0_8_;
  auVar230._8_8_ = auVar270._0_8_;
  auVar230._0_8_ = auVar270._0_8_;
  auVar145 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
  auVar163 = vshufpd_avx(auVar270,auVar270,3);
  auVar240 = vshufps_avx(auVar127,auVar247,0);
  auVar73._8_4_ = 0x3f800000;
  auVar73._0_8_ = 0x3f8000003f800000;
  auVar73._12_4_ = 0x3f800000;
  auVar183 = vsubps_avx(auVar73,auVar240);
  local_640 = auVar110._0_4_;
  fStack_63c = auVar110._4_4_;
  fStack_638 = auVar110._8_4_;
  fStack_634 = auVar110._12_4_;
  fVar120 = auVar240._0_4_;
  auVar74._0_4_ = fVar120 * local_640;
  fVar85 = auVar240._4_4_;
  auVar74._4_4_ = fVar85 * fStack_63c;
  fVar87 = auVar240._8_4_;
  auVar74._8_4_ = fVar87 * fStack_638;
  fVar162 = auVar240._12_4_;
  auVar74._12_4_ = fVar162 * fStack_634;
  auVar177._0_4_ = fVar120 * auVar145._0_4_;
  auVar177._4_4_ = fVar85 * auVar145._4_4_;
  auVar177._8_4_ = fVar87 * auVar145._8_4_;
  auVar177._12_4_ = fVar162 * auVar145._12_4_;
  auVar188._0_4_ = fVar120 * auVar163._0_4_;
  auVar188._4_4_ = fVar85 * auVar163._4_4_;
  auVar188._8_4_ = fVar87 * auVar163._8_4_;
  auVar188._12_4_ = fVar162 * auVar163._12_4_;
  auVar201._0_4_ = fVar120 * auVar90._0_4_;
  auVar201._4_4_ = fVar85 * auVar90._4_4_;
  auVar201._8_4_ = fVar87 * auVar90._8_4_;
  auVar201._12_4_ = fVar162 * auVar90._12_4_;
  auVar145 = vfmadd231ps_fma(auVar74,auVar183,auVar139);
  auVar163 = vfmadd231ps_fma(auVar177,auVar183,auVar214);
  auVar240 = vfmadd231ps_fma(auVar188,auVar183,auVar230);
  auVar183 = vfmadd231ps_fma(auVar201,auVar183,ZEXT816(0));
  auVar110 = vmovshdup_avx(auVar67);
  auVar270 = vfmadd231ss_fma(ZEXT416((uint)(auVar110._0_4_ * auVar127._0_4_)),auVar67,
                             ZEXT416((uint)(1.0 - auVar127._0_4_)));
  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar110._0_4_ * auVar247._0_4_)),auVar67,
                            ZEXT416((uint)(1.0 - auVar247._0_4_)));
  fVar120 = 1.0 / fVar84;
  auVar127 = vsubps_avx(auVar163,auVar145);
  auVar215._0_4_ = auVar127._0_4_ * 3.0;
  auVar215._4_4_ = auVar127._4_4_ * 3.0;
  auVar215._8_4_ = auVar127._8_4_ * 3.0;
  auVar215._12_4_ = auVar127._12_4_ * 3.0;
  auVar127 = vsubps_avx(auVar240,auVar163);
  auVar231._0_4_ = auVar127._0_4_ * 3.0;
  auVar231._4_4_ = auVar127._4_4_ * 3.0;
  auVar231._8_4_ = auVar127._8_4_ * 3.0;
  auVar231._12_4_ = auVar127._12_4_ * 3.0;
  auVar127 = vsubps_avx(auVar183,auVar240);
  auVar241._0_4_ = auVar127._0_4_ * 3.0;
  auVar241._4_4_ = auVar127._4_4_ * 3.0;
  auVar241._8_4_ = auVar127._8_4_ * 3.0;
  auVar241._12_4_ = auVar127._12_4_ * 3.0;
  auVar110 = vminps_avx(auVar231,auVar241);
  auVar127 = vmaxps_avx(auVar231,auVar241);
  auVar110 = vminps_avx(auVar215,auVar110);
  auVar127 = vmaxps_avx(auVar215,auVar127);
  auVar90 = vshufpd_avx(auVar110,auVar110,3);
  auVar247 = vshufpd_avx(auVar127,auVar127,3);
  auVar110 = vminps_avx(auVar110,auVar90);
  auVar127 = vmaxps_avx(auVar127,auVar247);
  auVar232._0_4_ = auVar110._0_4_ * fVar120;
  auVar232._4_4_ = auVar110._4_4_ * fVar120;
  auVar232._8_4_ = auVar110._8_4_ * fVar120;
  auVar232._12_4_ = auVar110._12_4_ * fVar120;
  auVar216._0_4_ = auVar127._0_4_ * fVar120;
  auVar216._4_4_ = auVar127._4_4_ * fVar120;
  auVar216._8_4_ = auVar127._8_4_ * fVar120;
  auVar216._12_4_ = auVar127._12_4_ * fVar120;
  fVar120 = 1.0 / (auVar67._0_4_ - auVar270._0_4_);
  auVar127 = vshufpd_avx(auVar145,auVar145,3);
  auVar110 = vshufpd_avx(auVar163,auVar163,3);
  auVar90 = vshufpd_avx(auVar240,auVar240,3);
  auVar247 = vshufpd_avx(auVar183,auVar183,3);
  auVar127 = vsubps_avx(auVar127,auVar145);
  auVar145 = vsubps_avx(auVar110,auVar163);
  auVar163 = vsubps_avx(auVar90,auVar240);
  auVar247 = vsubps_avx(auVar247,auVar183);
  auVar110 = vminps_avx(auVar127,auVar145);
  auVar127 = vmaxps_avx(auVar127,auVar145);
  auVar90 = vminps_avx(auVar163,auVar247);
  auVar90 = vminps_avx(auVar110,auVar90);
  auVar110 = vmaxps_avx(auVar163,auVar247);
  auVar127 = vmaxps_avx(auVar127,auVar110);
  auVar260._0_4_ = fVar120 * auVar90._0_4_;
  auVar260._4_4_ = fVar120 * auVar90._4_4_;
  auVar260._8_4_ = fVar120 * auVar90._8_4_;
  auVar260._12_4_ = fVar120 * auVar90._12_4_;
  auVar248._0_4_ = fVar120 * auVar127._0_4_;
  auVar248._4_4_ = fVar120 * auVar127._4_4_;
  auVar248._8_4_ = fVar120 * auVar127._8_4_;
  auVar248._12_4_ = fVar120 * auVar127._12_4_;
  auVar247 = vinsertps_avx(auVar7,auVar270,0x10);
  auVar145 = vinsertps_avx(auVar8,auVar67,0x10);
  auVar242._0_4_ = (auVar247._0_4_ + auVar145._0_4_) * 0.5;
  auVar242._4_4_ = (auVar247._4_4_ + auVar145._4_4_) * 0.5;
  auVar242._8_4_ = (auVar247._8_4_ + auVar145._8_4_) * 0.5;
  auVar242._12_4_ = (auVar247._12_4_ + auVar145._12_4_) * 0.5;
  auVar75._4_4_ = auVar242._0_4_;
  auVar75._0_4_ = auVar242._0_4_;
  auVar75._8_4_ = auVar242._0_4_;
  auVar75._12_4_ = auVar242._0_4_;
  auVar127 = vfmadd213ps_fma(local_390,auVar75,auVar10);
  auVar110 = vfmadd213ps_fma(local_3a0,auVar75,auVar11);
  auVar90 = vfmadd213ps_fma(local_3b0,auVar75,auVar12);
  auVar8 = vsubps_avx(auVar110,auVar127);
  auVar127 = vfmadd213ps_fma(auVar8,auVar75,auVar127);
  auVar8 = vsubps_avx(auVar90,auVar110);
  auVar8 = vfmadd213ps_fma(auVar8,auVar75,auVar110);
  auVar8 = vsubps_avx(auVar8,auVar127);
  auVar127 = vfmadd231ps_fma(auVar127,auVar8,auVar75);
  auVar76._0_8_ = CONCAT44(auVar8._4_4_ * 3.0,auVar8._0_4_ * 3.0);
  auVar76._8_4_ = auVar8._8_4_ * 3.0;
  auVar76._12_4_ = auVar8._12_4_ * 3.0;
  auVar273._8_8_ = auVar127._0_8_;
  auVar273._0_8_ = auVar127._0_8_;
  auVar8 = vshufpd_avx(auVar127,auVar127,3);
  auVar127 = vshufps_avx(auVar242,auVar242,0x55);
  auVar240 = vsubps_avx(auVar8,auVar273);
  auVar209 = vfmadd231ps_fma(auVar273,auVar127,auVar240);
  auVar279._8_8_ = auVar76._0_8_;
  auVar279._0_8_ = auVar76._0_8_;
  auVar8 = vshufpd_avx(auVar76,auVar76,3);
  auVar8 = vsubps_avx(auVar8,auVar279);
  auVar183 = vfmadd213ps_fma(auVar8,auVar127,auVar279);
  auVar127 = vmovshdup_avx(auVar183);
  auVar280._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
  auVar280._8_4_ = auVar127._8_4_ ^ 0x80000000;
  auVar280._12_4_ = auVar127._12_4_ ^ 0x80000000;
  auVar110 = vmovshdup_avx(auVar240);
  auVar8 = vunpcklps_avx(auVar110,auVar280);
  auVar90 = vshufps_avx(auVar8,auVar280,4);
  auVar163 = vshufps_avx(auVar242,auVar242,0x54);
  auVar129._0_8_ = auVar240._0_8_ ^ 0x8000000080000000;
  auVar129._8_4_ = auVar240._8_4_ ^ 0x80000000;
  auVar129._12_4_ = auVar240._12_4_ ^ 0x80000000;
  auVar8 = vmovlhps_avx(auVar129,auVar183);
  auVar8 = vshufps_avx(auVar8,auVar183,8);
  auVar127 = vfmsub231ss_fma(ZEXT416((uint)(auVar240._0_4_ * auVar127._0_4_)),auVar110,auVar183);
  uVar56 = auVar127._0_4_;
  auVar77._4_4_ = uVar56;
  auVar77._0_4_ = uVar56;
  auVar77._8_4_ = uVar56;
  auVar77._12_4_ = uVar56;
  auVar127 = vdivps_avx(auVar90,auVar77);
  auVar110 = vdivps_avx(auVar8,auVar77);
  fVar87 = auVar209._0_4_;
  fVar120 = auVar127._0_4_;
  auVar8 = vshufps_avx(auVar209,auVar209,0x55);
  fVar85 = auVar110._0_4_;
  auVar78._0_4_ = fVar87 * fVar120 + auVar8._0_4_ * fVar85;
  auVar78._4_4_ = fVar87 * auVar127._4_4_ + auVar8._4_4_ * auVar110._4_4_;
  auVar78._8_4_ = fVar87 * auVar127._8_4_ + auVar8._8_4_ * auVar110._8_4_;
  auVar78._12_4_ = fVar87 * auVar127._12_4_ + auVar8._12_4_ * auVar110._12_4_;
  auVar269 = vsubps_avx(auVar163,auVar78);
  auVar163 = vmovshdup_avx(auVar127);
  auVar8 = vinsertps_avx(auVar232,auVar260,0x1c);
  auVar153._0_4_ = auVar163._0_4_ * auVar8._0_4_;
  auVar153._4_4_ = auVar163._4_4_ * auVar8._4_4_;
  auVar153._8_4_ = auVar163._8_4_ * auVar8._8_4_;
  auVar153._12_4_ = auVar163._12_4_ * auVar8._12_4_;
  auVar90 = vinsertps_avx(auVar216,auVar248,0x1c);
  auVar99._0_4_ = auVar90._0_4_ * auVar163._0_4_;
  auVar99._4_4_ = auVar90._4_4_ * auVar163._4_4_;
  auVar99._8_4_ = auVar90._8_4_ * auVar163._8_4_;
  auVar99._12_4_ = auVar90._12_4_ * auVar163._12_4_;
  auVar209 = vminps_avx(auVar153,auVar99);
  auVar183 = vmaxps_avx(auVar99,auVar153);
  auVar163 = vinsertps_avx(auVar260,auVar232,0x4c);
  auVar124 = vmovshdup_avx(auVar110);
  auVar240 = vinsertps_avx(auVar248,auVar216,0x4c);
  auVar249._0_4_ = auVar124._0_4_ * auVar163._0_4_;
  auVar249._4_4_ = auVar124._4_4_ * auVar163._4_4_;
  auVar249._8_4_ = auVar124._8_4_ * auVar163._8_4_;
  auVar249._12_4_ = auVar124._12_4_ * auVar163._12_4_;
  auVar233._0_4_ = auVar124._0_4_ * auVar240._0_4_;
  auVar233._4_4_ = auVar124._4_4_ * auVar240._4_4_;
  auVar233._8_4_ = auVar124._8_4_ * auVar240._8_4_;
  auVar233._12_4_ = auVar124._12_4_ * auVar240._12_4_;
  auVar124 = vminps_avx(auVar249,auVar233);
  auVar261._0_4_ = auVar209._0_4_ + auVar124._0_4_;
  auVar261._4_4_ = auVar209._4_4_ + auVar124._4_4_;
  auVar261._8_4_ = auVar209._8_4_ + auVar124._8_4_;
  auVar261._12_4_ = auVar209._12_4_ + auVar124._12_4_;
  auVar209 = vmaxps_avx(auVar233,auVar249);
  auVar100._0_4_ = auVar209._0_4_ + auVar183._0_4_;
  auVar100._4_4_ = auVar209._4_4_ + auVar183._4_4_;
  auVar100._8_4_ = auVar209._8_4_ + auVar183._8_4_;
  auVar100._12_4_ = auVar209._12_4_ + auVar183._12_4_;
  auVar234._8_8_ = 0x3f80000000000000;
  auVar234._0_8_ = 0x3f80000000000000;
  auVar183 = vsubps_avx(auVar234,auVar100);
  auVar209 = vsubps_avx(auVar234,auVar261);
  auVar124 = vsubps_avx(auVar247,auVar242);
  auVar225 = vsubps_avx(auVar145,auVar242);
  auVar116._0_4_ = fVar120 * auVar8._0_4_;
  auVar116._4_4_ = fVar120 * auVar8._4_4_;
  auVar116._8_4_ = fVar120 * auVar8._8_4_;
  auVar116._12_4_ = fVar120 * auVar8._12_4_;
  auVar262._0_4_ = fVar120 * auVar90._0_4_;
  auVar262._4_4_ = fVar120 * auVar90._4_4_;
  auVar262._8_4_ = fVar120 * auVar90._8_4_;
  auVar262._12_4_ = fVar120 * auVar90._12_4_;
  auVar90 = vminps_avx(auVar116,auVar262);
  auVar8 = vmaxps_avx(auVar262,auVar116);
  auVar154._0_4_ = fVar85 * auVar163._0_4_;
  auVar154._4_4_ = fVar85 * auVar163._4_4_;
  auVar154._8_4_ = fVar85 * auVar163._8_4_;
  auVar154._12_4_ = fVar85 * auVar163._12_4_;
  auVar217._0_4_ = fVar85 * auVar240._0_4_;
  auVar217._4_4_ = fVar85 * auVar240._4_4_;
  auVar217._8_4_ = fVar85 * auVar240._8_4_;
  auVar217._12_4_ = fVar85 * auVar240._12_4_;
  auVar163 = vminps_avx(auVar154,auVar217);
  auVar263._0_4_ = auVar90._0_4_ + auVar163._0_4_;
  auVar263._4_4_ = auVar90._4_4_ + auVar163._4_4_;
  auVar263._8_4_ = auVar90._8_4_ + auVar163._8_4_;
  auVar263._12_4_ = auVar90._12_4_ + auVar163._12_4_;
  fVar266 = auVar124._0_4_;
  auVar274._0_4_ = fVar266 * auVar183._0_4_;
  fVar267 = auVar124._4_4_;
  auVar274._4_4_ = fVar267 * auVar183._4_4_;
  fVar268 = auVar124._8_4_;
  auVar274._8_4_ = fVar268 * auVar183._8_4_;
  fVar193 = auVar124._12_4_;
  auVar274._12_4_ = fVar193 * auVar183._12_4_;
  auVar90 = vmaxps_avx(auVar217,auVar154);
  auVar218._0_4_ = fVar266 * auVar209._0_4_;
  auVar218._4_4_ = fVar267 * auVar209._4_4_;
  auVar218._8_4_ = fVar268 * auVar209._8_4_;
  auVar218._12_4_ = fVar193 * auVar209._12_4_;
  fVar87 = auVar225._0_4_;
  auVar101._0_4_ = fVar87 * auVar183._0_4_;
  fVar162 = auVar225._4_4_;
  auVar101._4_4_ = fVar162 * auVar183._4_4_;
  fVar60 = auVar225._8_4_;
  auVar101._8_4_ = fVar60 * auVar183._8_4_;
  fVar224 = auVar225._12_4_;
  auVar101._12_4_ = fVar224 * auVar183._12_4_;
  auVar235._0_4_ = fVar87 * auVar209._0_4_;
  auVar235._4_4_ = fVar162 * auVar209._4_4_;
  auVar235._8_4_ = fVar60 * auVar209._8_4_;
  auVar235._12_4_ = fVar224 * auVar209._12_4_;
  auVar117._0_4_ = auVar8._0_4_ + auVar90._0_4_;
  auVar117._4_4_ = auVar8._4_4_ + auVar90._4_4_;
  auVar117._8_4_ = auVar8._8_4_ + auVar90._8_4_;
  auVar117._12_4_ = auVar8._12_4_ + auVar90._12_4_;
  auVar155._8_8_ = 0x3f800000;
  auVar155._0_8_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar155,auVar117);
  auVar90 = vsubps_avx(auVar155,auVar263);
  auVar264._0_4_ = fVar266 * auVar8._0_4_;
  auVar264._4_4_ = fVar267 * auVar8._4_4_;
  auVar264._8_4_ = fVar268 * auVar8._8_4_;
  auVar264._12_4_ = fVar193 * auVar8._12_4_;
  auVar250._0_4_ = fVar266 * auVar90._0_4_;
  auVar250._4_4_ = fVar267 * auVar90._4_4_;
  auVar250._8_4_ = fVar268 * auVar90._8_4_;
  auVar250._12_4_ = fVar193 * auVar90._12_4_;
  auVar118._0_4_ = fVar87 * auVar8._0_4_;
  auVar118._4_4_ = fVar162 * auVar8._4_4_;
  auVar118._8_4_ = fVar60 * auVar8._8_4_;
  auVar118._12_4_ = fVar224 * auVar8._12_4_;
  auVar156._0_4_ = fVar87 * auVar90._0_4_;
  auVar156._4_4_ = fVar162 * auVar90._4_4_;
  auVar156._8_4_ = fVar60 * auVar90._8_4_;
  auVar156._12_4_ = fVar224 * auVar90._12_4_;
  auVar8 = vminps_avx(auVar264,auVar250);
  auVar90 = vminps_avx(auVar118,auVar156);
  auVar8 = vminps_avx(auVar8,auVar90);
  auVar90 = vmaxps_avx(auVar250,auVar264);
  auVar163 = vmaxps_avx(auVar156,auVar118);
  auVar240 = vminps_avx(auVar274,auVar218);
  auVar183 = vminps_avx(auVar101,auVar235);
  auVar240 = vminps_avx(auVar240,auVar183);
  auVar8 = vhaddps_avx(auVar8,auVar240);
  auVar90 = vmaxps_avx(auVar163,auVar90);
  auVar163 = vmaxps_avx(auVar218,auVar274);
  auVar240 = vmaxps_avx(auVar235,auVar101);
  auVar163 = vmaxps_avx(auVar240,auVar163);
  auVar90 = vhaddps_avx(auVar90,auVar163);
  auVar8 = vshufps_avx(auVar8,auVar8,0xe8);
  auVar90 = vshufps_avx(auVar90,auVar90,0xe8);
  auVar236._0_4_ = auVar269._0_4_ + auVar8._0_4_;
  auVar236._4_4_ = auVar269._4_4_ + auVar8._4_4_;
  auVar236._8_4_ = auVar269._8_4_ + auVar8._8_4_;
  auVar236._12_4_ = auVar269._12_4_ + auVar8._12_4_;
  auVar219._0_4_ = auVar269._0_4_ + auVar90._0_4_;
  auVar219._4_4_ = auVar269._4_4_ + auVar90._4_4_;
  auVar219._8_4_ = auVar269._8_4_ + auVar90._8_4_;
  auVar219._12_4_ = auVar269._12_4_ + auVar90._12_4_;
  auVar222 = ZEXT1664(auVar219);
  auVar8 = vmaxps_avx(auVar247,auVar236);
  auVar90 = vminps_avx(auVar219,auVar145);
  auVar8 = vcmpps_avx(auVar90,auVar8,1);
  auVar8 = vshufps_avx(auVar8,auVar8,0x50);
  if ((auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar8[0xf] < '\0')
  goto LAB_0110ecf2;
  bVar51 = 0;
  if ((auVar192._0_4_ < auVar236._0_4_) && (bVar51 = 0, auVar219._0_4_ < auVar145._0_4_)) {
    auVar90 = vmovshdup_avx(auVar236);
    auVar8 = vcmpps_avx(auVar219,auVar145,1);
    bVar51 = auVar8[4] & auVar270._0_4_ < auVar90._0_4_;
  }
  if (((3 < (uint)uVar53 || fVar84 < 0.001) | bVar51) != 1) goto LAB_0110fb80;
  lVar50 = 0xc9;
  auVar222 = ZEXT464(0x40400000);
  do {
    lVar50 = lVar50 + -1;
    if (lVar50 == 0) goto LAB_0110ecf2;
    fVar162 = auVar269._0_4_;
    fVar87 = 1.0 - fVar162;
    fVar84 = fVar87 * fVar87 * fVar87;
    fVar86 = fVar162 * 3.0 * fVar87 * fVar87;
    fVar87 = fVar87 * fVar162 * fVar162 * 3.0;
    auVar140._4_4_ = fVar84;
    auVar140._0_4_ = fVar84;
    auVar140._8_4_ = fVar84;
    auVar140._12_4_ = fVar84;
    auVar119._4_4_ = fVar86;
    auVar119._0_4_ = fVar86;
    auVar119._8_4_ = fVar86;
    auVar119._12_4_ = fVar86;
    auVar102._4_4_ = fVar87;
    auVar102._0_4_ = fVar87;
    auVar102._8_4_ = fVar87;
    auVar102._12_4_ = fVar87;
    fVar162 = fVar162 * fVar162 * fVar162;
    auVar157._0_4_ = (float)local_3c0._0_4_ * fVar162;
    auVar157._4_4_ = (float)local_3c0._4_4_ * fVar162;
    auVar157._8_4_ = fStack_3b8 * fVar162;
    auVar157._12_4_ = fStack_3b4 * fVar162;
    auVar7 = vfmadd231ps_fma(auVar157,auVar12,auVar102);
    auVar7 = vfmadd231ps_fma(auVar7,auVar11,auVar119);
    auVar7 = vfmadd231ps_fma(auVar7,auVar10,auVar140);
    auVar103._8_8_ = auVar7._0_8_;
    auVar103._0_8_ = auVar7._0_8_;
    auVar7 = vshufpd_avx(auVar7,auVar7,3);
    auVar8 = vshufps_avx(auVar269,auVar269,0x55);
    auVar7 = vsubps_avx(auVar7,auVar103);
    auVar8 = vfmadd213ps_fma(auVar7,auVar8,auVar103);
    fVar84 = auVar8._0_4_;
    auVar7 = vshufps_avx(auVar8,auVar8,0x55);
    auVar104._0_4_ = fVar120 * fVar84 + fVar85 * auVar7._0_4_;
    auVar104._4_4_ = auVar127._4_4_ * fVar84 + auVar110._4_4_ * auVar7._4_4_;
    auVar104._8_4_ = auVar127._8_4_ * fVar84 + auVar110._8_4_ * auVar7._8_4_;
    auVar104._12_4_ = auVar127._12_4_ * fVar84 + auVar110._12_4_ * auVar7._12_4_;
    auVar269 = vsubps_avx(auVar269,auVar104);
    auVar7 = vandps_avx(auVar238,auVar8);
    auVar8 = vshufps_avx(auVar7,auVar7,0xf5);
    auVar7 = vmaxss_avx(auVar8,auVar7);
  } while ((float)local_3d0._0_4_ <= auVar7._0_4_);
  local_120 = auVar269._0_4_;
  if ((local_120 < 0.0) || (1.0 < local_120)) goto LAB_0110ecf2;
  auVar7 = vmovshdup_avx(auVar269);
  fVar84 = auVar7._0_4_;
  if ((fVar84 < 0.0) || (1.0 < fVar84)) goto LAB_0110ecf2;
  auVar8 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                         ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar240 = vinsertps_avx(auVar8,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar8 = vdpps_avx(auVar240,auVar62,0x7f);
  auVar127 = vdpps_avx(auVar240,auVar111,0x7f);
  auVar110 = vdpps_avx(auVar240,local_3e0,0x7f);
  auVar90 = vdpps_avx(auVar240,local_3f0,0x7f);
  auVar247 = vdpps_avx(auVar240,local_400,0x7f);
  auVar145 = vdpps_avx(auVar240,local_410,0x7f);
  auVar163 = vdpps_avx(auVar240,local_420,0x7f);
  auVar240 = vdpps_avx(auVar240,local_430,0x7f);
  fVar86 = 1.0 - fVar84;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar247._0_4_)),ZEXT416((uint)fVar86),auVar8);
  auVar127 = vfmadd231ss_fma(ZEXT416((uint)(auVar145._0_4_ * fVar84)),ZEXT416((uint)fVar86),auVar127
                            );
  auVar222 = ZEXT1664(auVar127);
  auVar110 = vfmadd231ss_fma(ZEXT416((uint)(auVar163._0_4_ * fVar84)),ZEXT416((uint)fVar86),auVar110
                            );
  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar240._0_4_)),ZEXT416((uint)fVar86),auVar90);
  fVar85 = 1.0 - local_120;
  fVar84 = fVar85 * local_120 * local_120 * 3.0;
  fVar162 = local_120 * local_120 * local_120;
  auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * auVar90._0_4_)),ZEXT416((uint)fVar84),auVar110
                            );
  fVar86 = local_120 * 3.0 * fVar85 * fVar85;
  auVar127 = vfmadd231ss_fma(auVar110,ZEXT416((uint)fVar86),auVar127);
  fVar120 = fVar85 * fVar85 * fVar85;
  auVar8 = vfmadd231ss_fma(auVar127,ZEXT416((uint)fVar120),auVar8);
  fVar87 = auVar8._0_4_;
  if ((fVar87 < fVar59) || (fVar60 = *(float *)(ray + k * 4 + 0x100), fVar60 < fVar87))
  goto LAB_0110ecf2;
  pGVar3 = (context->scene->geometries).items[uVar47].ptr;
  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar51 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0110fb16;
    auVar8 = vshufps_avx(auVar269,auVar269,0x55);
    auVar220._8_4_ = 0x3f800000;
    auVar220._0_8_ = 0x3f8000003f800000;
    auVar220._12_4_ = 0x3f800000;
    auVar127 = vsubps_avx(auVar220,auVar8);
    fVar224 = auVar8._0_4_;
    auVar237._0_4_ = fVar224 * auVar228._0_4_;
    fVar266 = auVar8._4_4_;
    auVar237._4_4_ = fVar266 * auVar228._4_4_;
    fVar267 = auVar8._8_4_;
    auVar237._8_4_ = fVar267 * auVar228._8_4_;
    fVar268 = auVar8._12_4_;
    auVar237._12_4_ = fVar268 * auVar228._12_4_;
    auVar243._0_4_ = fVar224 * auVar65._0_4_;
    auVar243._4_4_ = fVar266 * auVar65._4_4_;
    auVar243._8_4_ = fVar267 * auVar65._8_4_;
    auVar243._12_4_ = fVar268 * auVar65._12_4_;
    local_5d0 = auVar121._0_4_;
    fStack_5cc = auVar121._4_4_;
    fStack_5c8 = auVar121._8_4_;
    fStack_5c4 = auVar121._12_4_;
    auVar251._0_4_ = fVar224 * local_5d0;
    auVar251._4_4_ = fVar266 * fStack_5cc;
    auVar251._8_4_ = fVar267 * fStack_5c8;
    auVar251._12_4_ = fVar268 * fStack_5c4;
    auVar202._0_4_ = fVar224 * fVar161;
    auVar202._4_4_ = fVar266 * fVar180;
    auVar202._8_4_ = fVar267 * fVar181;
    auVar202._12_4_ = fVar268 * fVar182;
    auVar8 = vfmadd231ps_fma(auVar237,auVar127,auVar64);
    auVar110 = vfmadd231ps_fma(auVar243,auVar127,auVar122);
    auVar90 = vfmadd231ps_fma(auVar251,auVar127,auVar91);
    auVar247 = vfmadd231ps_fma(auVar202,auVar127,auVar63);
    auVar127 = vsubps_avx(auVar110,auVar8);
    auVar222 = ZEXT1664(auVar127);
    auVar8 = vsubps_avx(auVar90,auVar110);
    auVar110 = vsubps_avx(auVar247,auVar90);
    auVar252._0_4_ = local_120 * auVar8._0_4_;
    auVar252._4_4_ = local_120 * auVar8._4_4_;
    auVar252._8_4_ = local_120 * auVar8._8_4_;
    auVar252._12_4_ = local_120 * auVar8._12_4_;
    auVar189._4_4_ = fVar85;
    auVar189._0_4_ = fVar85;
    auVar189._8_4_ = fVar85;
    auVar189._12_4_ = fVar85;
    auVar90 = vfmadd231ps_fma(auVar252,auVar189,auVar127);
    auVar203._0_4_ = local_120 * auVar110._0_4_;
    auVar203._4_4_ = local_120 * auVar110._4_4_;
    auVar203._8_4_ = local_120 * auVar110._8_4_;
    auVar203._12_4_ = local_120 * auVar110._12_4_;
    auVar8 = vfmadd231ps_fma(auVar203,auVar189,auVar8);
    auVar204._0_4_ = local_120 * auVar8._0_4_;
    auVar204._4_4_ = local_120 * auVar8._4_4_;
    auVar204._8_4_ = local_120 * auVar8._8_4_;
    auVar204._12_4_ = local_120 * auVar8._12_4_;
    auVar110 = vfmadd231ps_fma(auVar204,auVar189,auVar90);
    auVar178._0_4_ = fVar162 * (float)local_490._0_4_;
    auVar178._4_4_ = fVar162 * (float)local_490._4_4_;
    auVar178._8_4_ = fVar162 * fStack_488;
    auVar178._12_4_ = fVar162 * fStack_484;
    auVar130._4_4_ = fVar84;
    auVar130._0_4_ = fVar84;
    auVar130._8_4_ = fVar84;
    auVar130._12_4_ = fVar84;
    auVar8 = vfmadd132ps_fma(auVar130,auVar178,local_480);
    auVar158._4_4_ = fVar86;
    auVar158._0_4_ = fVar86;
    auVar158._8_4_ = fVar86;
    auVar158._12_4_ = fVar86;
    auVar8 = vfmadd132ps_fma(auVar158,auVar8,local_470);
    auVar131._0_4_ = auVar110._0_4_ * 3.0;
    auVar131._4_4_ = auVar110._4_4_ * 3.0;
    auVar131._8_4_ = auVar110._8_4_ * 3.0;
    auVar131._12_4_ = auVar110._12_4_ * 3.0;
    auVar141._4_4_ = fVar120;
    auVar141._0_4_ = fVar120;
    auVar141._8_4_ = fVar120;
    auVar141._12_4_ = fVar120;
    auVar110 = vfmadd132ps_fma(auVar141,auVar8,local_460);
    auVar8 = vshufps_avx(auVar131,auVar131,0xc9);
    auVar159._0_4_ = auVar110._0_4_ * auVar8._0_4_;
    auVar159._4_4_ = auVar110._4_4_ * auVar8._4_4_;
    auVar159._8_4_ = auVar110._8_4_ * auVar8._8_4_;
    auVar159._12_4_ = auVar110._12_4_ * auVar8._12_4_;
    auVar8 = vshufps_avx(auVar110,auVar110,0xc9);
    auVar110 = vfmsub231ps_fma(auVar159,auVar131,auVar8);
    auVar8 = vmovshdup_avx(auVar110);
    local_180 = auVar8._0_8_;
    uStack_178 = local_180;
    uStack_170 = local_180;
    uStack_168 = local_180;
    auVar8 = vshufps_avx(auVar110,auVar110,0xaa);
    local_160 = auVar8._0_8_;
    uStack_158 = local_160;
    uStack_150 = local_160;
    uStack_148 = local_160;
    local_140 = auVar110._0_4_;
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_100 = auVar7._0_8_;
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    local_e0 = CONCAT44(uStack_33c,local_340);
    uStack_d8 = CONCAT44(uStack_334,uStack_338);
    uStack_d0 = CONCAT44(uStack_32c,uStack_330);
    uStack_c8 = CONCAT44(uStack_324,uStack_328);
    local_c0._4_4_ = uStack_31c;
    local_c0._0_4_ = local_320;
    local_c0._8_4_ = uStack_318;
    local_c0._12_4_ = uStack_314;
    local_c0._16_4_ = uStack_310;
    local_c0._20_4_ = uStack_30c;
    local_c0._24_4_ = uStack_308;
    local_c0._28_4_ = uStack_304;
    vpcmpeqd_avx2(local_c0,local_c0);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar87;
    local_4c0 = local_360;
    local_510.valid = (int *)local_4c0;
    local_510.geometryUserPtr = pGVar3->userPtr;
    local_510.context = context->user;
    local_510.ray = (RTCRayN *)ray;
    local_510.hit = (RTCHitN *)&local_180;
    local_510.N = 8;
    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      auVar222 = ZEXT1664(auVar127);
      (*pGVar3->occlusionFilterN)(&local_510);
    }
    auVar80 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
    auVar80 = _DAT_01f7b020 & ~auVar80;
    if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar80 >> 0x7f,0) != '\0') ||
          (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar80 >> 0xbf,0) != '\0') ||
        (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar80[0x1f] < '\0')
    {
      p_Var4 = context->args->filter;
      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
        auVar222 = ZEXT1664(auVar222._0_16_);
        (*p_Var4)(&local_510);
      }
      auVar14 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
      auVar109._8_4_ = 0xff800000;
      auVar109._0_8_ = 0xff800000ff800000;
      auVar109._12_4_ = 0xff800000;
      auVar109._16_4_ = 0xff800000;
      auVar109._20_4_ = 0xff800000;
      auVar109._24_4_ = 0xff800000;
      auVar109._28_4_ = 0xff800000;
      auVar80 = vblendvps_avx(auVar109,*(undefined1 (*) [32])(local_510.ray + 0x100),auVar14);
      *(undefined1 (*) [32])(local_510.ray + 0x100) = auVar80;
      auVar80 = _DAT_01f7b020 & ~auVar14;
      if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar80 >> 0x7f,0) != '\0') ||
            (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar80 >> 0xbf,0) != '\0') ||
          (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar80[0x1f] < '\0') {
        bVar51 = 1;
        goto LAB_0110fb16;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar60;
  }
  bVar51 = 0;
LAB_0110fb16:
  bVar57 = (bool)(bVar57 | bVar51);
  goto LAB_0110ecf2;
LAB_0110fb80:
  local_440 = vinsertps_avx(auVar7,ZEXT416((uint)fVar86),0x10);
  auVar67 = vinsertps_avx(auVar270,ZEXT416((uint)auVar67._0_4_),0x10);
  goto LAB_0110e748;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }